

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::Compilation(Compilation *this,Bag *options,SourceLibrary *defaultLib)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  Type *pTVar6;
  value_type_pointer ppVar7;
  group_type_pointer pgVar8;
  value_type_pointer ppVar9;
  ulong uVar10;
  group_type_pointer pgVar11;
  value_type_pointer ppVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  anon_class_8_1_8991fb9c aVar17;
  undefined4 uVar18;
  undefined1 auVar19 [8];
  undefined8 __p;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *this_00;
  bool bVar20;
  byte bVar21;
  int iVar22;
  PackageSymbol *pPVar23;
  uint64_t uVar24;
  SourceLibrary *pSVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  Scope *pSVar30;
  uint64_t uVar31;
  long lVar32;
  ulong uVar33;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  *this_01;
  string_view *sv;
  long *in_FS_OFFSET;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uchar uVar48;
  uchar uVar75;
  uchar uVar76;
  byte bVar77;
  uchar uVar78;
  uchar uVar79;
  uchar uVar80;
  byte bVar81;
  uchar uVar82;
  uchar uVar83;
  uchar uVar84;
  byte bVar85;
  uchar uVar86;
  uchar uVar87;
  uchar uVar88;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  byte bVar89;
  try_emplace_args_t local_483;
  TokenKind local_482;
  SourceLibrary *local_480;
  anon_class_8_1_8991fb9c registerScalar;
  undefined1 local_46c [4];
  undefined1 local_468 [8];
  _Alloc_hider local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  Scope *local_448;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  *local_438;
  SyntaxNode *local_430;
  Type *local_428;
  ulong local_420;
  uint64_t local_418;
  ulong local_410;
  unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *local_408;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_400;
  unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *local_3f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  *local_3f0;
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  *local_3e8;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  *local_3e0;
  undefined8 local_3d8;
  uchar uStack_3d0;
  uchar uStack_3cf;
  uchar uStack_3ce;
  byte bStack_3cd;
  uchar uStack_3cc;
  uchar uStack_3cb;
  uchar uStack_3ca;
  byte bStack_3c9;
  undefined8 local_3c8;
  uchar uStack_3c0;
  uchar uStack_3bf;
  uchar uStack_3be;
  byte bStack_3bd;
  uchar uStack_3bc;
  uchar uStack_3bb;
  uchar uStack_3ba;
  byte bStack_3b9;
  ulong local_3b0;
  flat_hash_map<const_Symbol_*,_AliasIntervalMap> *local_3a8;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_const_syntax::SyntaxNode_*> *local_3a0;
  flat_hash_map<const_DefinitionSymbol_*,_std::vector<const_Symbol_*>_> *local_398;
  flat_hash_map<const_syntax::SyntaxNode_*,_const_ConfigBlockSymbol_*> *local_390;
  flat_hash_map<std::string_view,_std::vector<const_ConfigBlockSymbol_*>_> *local_388;
  flat_hash_map<const_Scope_*,_const_Expression_*> *local_380;
  flat_hash_map<const_Scope_*,_const_Symbol_*> *local_378;
  flat_hash_map<const_Symbol_*,_const_Symbol_*> *local_370;
  HierarchyOverrideNode *local_368;
  flat_hash_set<std::string_view> *local_360;
  flat_hash_map<const_syntax::ModuleDeclarationSyntax_*,_std::vector<DefinitionSymbol_*>_>
  *local_358;
  flat_hash_map<std::string_view,_const_PrimitiveSymbol_*> *local_350;
  Diagnostic *local_348;
  TypedBumpAllocator<slang::ast::Scope::WildcardImportData> *local_340;
  TypedBumpAllocator<slang::ast::ConfigBlockSymbol> *local_338;
  TypedBumpAllocator<slang::ast::AssertionInstanceDetails> *local_330;
  TypedBumpAllocator<slang::ast::GenericClassDefSymbol> *local_328;
  flat_hash_map<std::tuple<std::string_view,_std::string_view,_const_Scope_*>,_std::tuple<const_syntax::SyntaxNode_*,_const_syntax::ScopedNameSyntax_*,_SymbolIndex,_bool>_>
  *local_320;
  ASTDiagMap *local_318;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *local_310;
  flat_hash_map<const_void_*,_std::span<const_AttributeSymbol_*const>_> *local_308;
  flat_hash_map<const_Symbol_*,_std::unique_ptr<InstanceSideEffects>_> *local_300;
  flat_hash_map<uint32_t,_const_Type_*> *local_2f8;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_std::pair<std::vector<Symbol_*>,_bool>_>
  *local_2f0;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<bool,_bool>_> *local_2e8;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
  *local_2e0;
  TypedBumpAllocator<slang::ConstantValue> *local_2d8;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  *local_2d0;
  TypedBumpAllocator<boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *local_2c8;
  CompilationOptions *local_2c0;
  uchar local_2b8;
  uchar uStack_2b7;
  uchar uStack_2b6;
  byte bStack_2b5;
  uchar uStack_2b4;
  uchar uStack_2b3;
  uchar uStack_2b2;
  byte bStack_2b1;
  uchar uStack_2b0;
  uchar uStack_2af;
  uchar uStack_2ae;
  byte bStack_2ad;
  uchar uStack_2ac;
  uchar uStack_2ab;
  uchar uStack_2aa;
  byte bStack_2a9;
  uchar local_2a8;
  uchar uStack_2a7;
  uchar uStack_2a6;
  byte bStack_2a5;
  uchar uStack_2a4;
  uchar uStack_2a3;
  uchar uStack_2a2;
  byte bStack_2a1;
  uchar uStack_2a0;
  uchar uStack_29f;
  uchar uStack_29e;
  byte bStack_29d;
  uchar uStack_29c;
  uchar uStack_29b;
  uchar uStack_29a;
  byte bStack_299;
  uchar local_298;
  uchar uStack_297;
  uchar uStack_296;
  uchar uStack_295;
  uchar uStack_294;
  uchar uStack_293;
  uchar uStack_292;
  uchar uStack_291;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  uchar uStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  byte bStack_289;
  uchar local_288;
  uchar uStack_287;
  uchar uStack_286;
  uchar uStack_285;
  uchar uStack_284;
  uchar uStack_283;
  uchar uStack_282;
  uchar uStack_281;
  uchar uStack_280;
  uchar uStack_27f;
  uchar uStack_27e;
  uchar uStack_27d;
  uchar uStack_27c;
  uchar uStack_27b;
  uchar uStack_27a;
  byte bStack_279;
  uchar local_278;
  uchar uStack_277;
  uchar uStack_276;
  uchar uStack_275;
  uchar uStack_274;
  uchar uStack_273;
  uchar uStack_272;
  uchar uStack_271;
  uchar uStack_270;
  uchar uStack_26f;
  uchar uStack_26e;
  uchar uStack_26d;
  uchar uStack_26c;
  uchar uStack_26b;
  uchar uStack_26a;
  byte bStack_269;
  uchar local_268;
  uchar uStack_267;
  uchar uStack_266;
  uchar uStack_265;
  uchar uStack_264;
  uchar uStack_263;
  uchar uStack_262;
  uchar uStack_261;
  uchar uStack_260;
  uchar uStack_25f;
  uchar uStack_25e;
  uchar uStack_25d;
  uchar uStack_25c;
  uchar uStack_25b;
  uchar uStack_25a;
  byte bStack_259;
  uchar local_258;
  uchar uStack_257;
  uchar uStack_256;
  uchar uStack_255;
  uchar uStack_254;
  uchar uStack_253;
  uchar uStack_252;
  uchar uStack_251;
  uchar uStack_250;
  uchar uStack_24f;
  uchar uStack_24e;
  uchar uStack_24d;
  uchar uStack_24c;
  uchar uStack_24b;
  uchar uStack_24a;
  byte bStack_249;
  uchar local_248;
  uchar uStack_247;
  uchar uStack_246;
  uchar uStack_245;
  uchar uStack_244;
  uchar uStack_243;
  uchar uStack_242;
  uchar uStack_241;
  uchar uStack_240;
  uchar uStack_23f;
  uchar uStack_23e;
  uchar uStack_23d;
  uchar uStack_23c;
  uchar uStack_23b;
  uchar uStack_23a;
  byte bStack_239;
  uchar local_238;
  uchar uStack_237;
  uchar uStack_236;
  uchar uStack_235;
  uchar uStack_234;
  uchar uStack_233;
  uchar uStack_232;
  uchar uStack_231;
  uchar uStack_230;
  uchar uStack_22f;
  uchar uStack_22e;
  uchar uStack_22d;
  uchar uStack_22c;
  uchar uStack_22b;
  uchar uStack_22a;
  byte bStack_229;
  uchar local_228;
  uchar uStack_227;
  uchar uStack_226;
  uchar uStack_225;
  uchar uStack_224;
  uchar uStack_223;
  uchar uStack_222;
  uchar uStack_221;
  uchar uStack_220;
  uchar uStack_21f;
  uchar uStack_21e;
  uchar uStack_21d;
  uchar uStack_21c;
  uchar uStack_21b;
  uchar uStack_21a;
  byte bStack_219;
  uchar local_218;
  uchar uStack_217;
  uchar uStack_216;
  uchar uStack_215;
  uchar uStack_214;
  uchar uStack_213;
  uchar uStack_212;
  uchar uStack_211;
  uchar uStack_210;
  uchar uStack_20f;
  uchar uStack_20e;
  uchar uStack_20d;
  uchar uStack_20c;
  uchar uStack_20b;
  uchar uStack_20a;
  byte bStack_209;
  uchar local_208;
  uchar uStack_207;
  uchar uStack_206;
  uchar uStack_205;
  uchar uStack_204;
  uchar uStack_203;
  uchar uStack_202;
  uchar uStack_201;
  uchar uStack_200;
  uchar uStack_1ff;
  uchar uStack_1fe;
  uchar uStack_1fd;
  uchar uStack_1fc;
  uchar uStack_1fb;
  uchar uStack_1fa;
  byte bStack_1f9;
  uchar local_1f8;
  uchar uStack_1f7;
  uchar uStack_1f6;
  uchar uStack_1f5;
  uchar uStack_1f4;
  uchar uStack_1f3;
  uchar uStack_1f2;
  uchar uStack_1f1;
  uchar uStack_1f0;
  uchar uStack_1ef;
  uchar uStack_1ee;
  uchar uStack_1ed;
  uchar uStack_1ec;
  uchar uStack_1eb;
  uchar uStack_1ea;
  uchar uStack_1e9;
  uchar local_1e8;
  uchar uStack_1e7;
  uchar uStack_1e6;
  uchar uStack_1e5;
  uchar uStack_1e4;
  uchar uStack_1e3;
  uchar uStack_1e2;
  uchar uStack_1e1;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  uchar uStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  uchar uStack_1d9;
  uchar local_1d8;
  uchar uStack_1d7;
  uchar uStack_1d6;
  uchar uStack_1d5;
  uchar uStack_1d4;
  uchar uStack_1d3;
  uchar uStack_1d2;
  uchar uStack_1d1;
  uchar uStack_1d0;
  uchar uStack_1cf;
  uchar uStack_1ce;
  uchar uStack_1cd;
  uchar uStack_1cc;
  uchar uStack_1cb;
  uchar uStack_1ca;
  byte bStack_1c9;
  uchar local_1c8;
  uchar uStack_1c7;
  uchar uStack_1c6;
  uchar uStack_1c5;
  uchar uStack_1c4;
  uchar uStack_1c3;
  uchar uStack_1c2;
  uchar uStack_1c1;
  uchar uStack_1c0;
  uchar uStack_1bf;
  uchar uStack_1be;
  uchar uStack_1bd;
  uchar uStack_1bc;
  uchar uStack_1bb;
  uchar uStack_1ba;
  byte bStack_1b9;
  uchar local_1b8;
  uchar uStack_1b7;
  uchar uStack_1b6;
  uchar uStack_1b5;
  uchar uStack_1b4;
  uchar uStack_1b3;
  uchar uStack_1b2;
  uchar uStack_1b1;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  uchar uStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  byte bStack_1a9;
  uchar local_1a8;
  uchar uStack_1a7;
  uchar uStack_1a6;
  uchar uStack_1a5;
  uchar uStack_1a4;
  uchar uStack_1a3;
  uchar uStack_1a2;
  uchar uStack_1a1;
  uchar uStack_1a0;
  uchar uStack_19f;
  uchar uStack_19e;
  uchar uStack_19d;
  uchar uStack_19c;
  uchar uStack_19b;
  uchar uStack_19a;
  byte bStack_199;
  uchar local_198;
  uchar uStack_197;
  uchar uStack_196;
  uchar uStack_195;
  uchar uStack_194;
  uchar uStack_193;
  uchar uStack_192;
  uchar uStack_191;
  uchar uStack_190;
  uchar uStack_18f;
  uchar uStack_18e;
  uchar uStack_18d;
  uchar uStack_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  byte bStack_189;
  uchar local_188;
  uchar uStack_187;
  uchar uStack_186;
  uchar uStack_185;
  uchar uStack_184;
  uchar uStack_183;
  uchar uStack_182;
  uchar uStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  uchar uStack_17d;
  uchar uStack_17c;
  uchar uStack_17b;
  uchar uStack_17a;
  byte bStack_179;
  uchar local_178;
  uchar uStack_177;
  uchar uStack_176;
  uchar uStack_175;
  uchar uStack_174;
  uchar uStack_173;
  uchar uStack_172;
  uchar uStack_171;
  uchar uStack_170;
  uchar uStack_16f;
  uchar uStack_16e;
  uchar uStack_16d;
  uchar uStack_16c;
  uchar uStack_16b;
  uchar uStack_16a;
  byte bStack_169;
  uchar local_168;
  uchar uStack_167;
  uchar uStack_166;
  uchar uStack_165;
  uchar uStack_164;
  uchar uStack_163;
  uchar uStack_162;
  uchar uStack_161;
  uchar uStack_160;
  uchar uStack_15f;
  uchar uStack_15e;
  uchar uStack_15d;
  uchar uStack_15c;
  uchar uStack_15b;
  uchar uStack_15a;
  byte bStack_159;
  uchar local_158;
  uchar uStack_157;
  uchar uStack_156;
  uchar uStack_155;
  uchar uStack_154;
  uchar uStack_153;
  uchar uStack_152;
  uchar uStack_151;
  uchar uStack_150;
  uchar uStack_14f;
  uchar uStack_14e;
  uchar uStack_14d;
  uchar uStack_14c;
  uchar uStack_14b;
  uchar uStack_14a;
  byte bStack_149;
  uchar local_148;
  uchar uStack_147;
  uchar uStack_146;
  uchar uStack_145;
  uchar uStack_144;
  uchar uStack_143;
  uchar uStack_142;
  uchar uStack_141;
  uchar uStack_140;
  uchar uStack_13f;
  uchar uStack_13e;
  uchar uStack_13d;
  uchar uStack_13c;
  uchar uStack_13b;
  uchar uStack_13a;
  byte bStack_139;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  uchar local_128;
  uchar uStack_127;
  uchar uStack_126;
  uchar uStack_125;
  uchar uStack_124;
  uchar uStack_123;
  uchar uStack_122;
  uchar uStack_121;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  uchar uStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  byte bStack_119;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  uchar uStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  uchar uStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  uchar uStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  uchar local_108;
  uchar uStack_107;
  uchar uStack_106;
  uchar uStack_105;
  uchar uStack_104;
  uchar uStack_103;
  uchar uStack_102;
  uchar uStack_101;
  uchar uStack_100;
  uchar uStack_ff;
  uchar uStack_fe;
  uchar uStack_fd;
  uchar uStack_fc;
  uchar uStack_fb;
  uchar uStack_fa;
  byte bStack_f9;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  uchar uStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  uchar uStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  uchar uStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  uchar uStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  uchar uStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  uchar uStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  uchar uStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  uchar uStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  uchar uStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  uchar uStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  uchar uStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  uchar uStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  uchar uStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  uchar uStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  uchar uStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  uchar uStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  uchar uStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  uchar uStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  uchar uStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  uchar uStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  uchar uStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  uchar uStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  uchar uStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  BumpAllocator::BumpAllocator(&this->super_BumpAllocator);
  local_2c0 = &this->options;
  Bag::getOrDefault<slang::ast::CompilationOptions>(local_2c0,options);
  BumpAllocator::BumpAllocator(&(this->symbolMapAllocator).super_BumpAllocator);
  local_2d0 = &this->pointerMapAllocator;
  local_2c8 = &this->symbolMapAllocator;
  BumpAllocator::BumpAllocator(&local_2d0->super_BumpAllocator);
  local_2d8 = &this->constantAllocator;
  BumpAllocator::BumpAllocator(&local_2d8->super_BumpAllocator);
  (this->driverMapAllocator).alloc = &this->super_BumpAllocator;
  (this->driverMapAllocator).freeList = (FreeNode *)0x0;
  (this->unrollIntervalMapAllocator).alloc = &this->super_BumpAllocator;
  local_2e0 = &this->deferredData;
  *(undefined1 (*) [16])&(this->unrollIntervalMapAllocator).freeList = (undefined1  [16])0x0;
  this->scalarTypeTable[1] = (Type *)0x0;
  this->scalarTypeTable[2] = (Type *)0x0;
  this->scalarTypeTable[3] = (Type *)0x0;
  this->scalarTypeTable[4] = (Type *)0x0;
  this->scalarTypeTable[5] = (Type *)0x0;
  this->scalarTypeTable[6] = (Type *)0x0;
  this->scalarTypeTable[7] = (Type *)0x0;
  SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
  SafeIndexedVector(local_2e0);
  local_2e8 = &this->referenceStatusMap;
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<bool,_bool>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<bool,_bool>_>_>_>
  ::unordered_flat_map(local_2e8);
  local_2f0 = &this->definitionMap;
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
  ::unordered_flat_map(local_2f0);
  local_2f8 = &this->vectorTypeCache;
  boost::unordered::
  unordered_flat_map<unsigned_int,_const_slang::ast::Type_*,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
  ::unordered_flat_map(local_2f8);
  local_3e0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
               *)&this->knownTypes;
  boost::unordered::
  unordered_flat_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<slang::syntax::SyntaxKind,_const_slang::ast::Type_*,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
              *)local_3e0);
  this_01 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
             *)&this->knownNetTypes;
  boost::unordered::
  unordered_flat_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
              *)this_01);
  local_428 = (Type *)&this->packageMap;
  local_438 = this_01;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>
              *)local_428);
  local_3e8 = &this->systemSubroutines;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->systemSubroutines).
  super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)&this->methodMap;
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *)local_3f0);
  local_300 = &this->instanceSideEffectMap;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>_>_>_>
  ::unordered_flat_map(local_300);
  local_308 = &this->attributeMap;
  boost::unordered::
  unordered_flat_map<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  ::unordered_flat_map(local_308);
  local_310 = &this->syntaxMetadata;
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
  ::unordered_flat_map(local_310);
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->definitionMemory).
  super__Vector_base<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>,_std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318 = &this->diagMap;
  boost::unordered::
  unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
  ::unordered_flat_map(&local_318->map);
  local_320 = &this->outOfBlockDecls;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->virtualInterfaceInstances).
  super__Vector_base<const_slang::ast::InstanceSymbol_*,_std::allocator<const_slang::ast::InstanceSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->defaultLiblist).
    super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->defaultLiblist).
  super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hierarchicalAssignments).
  super__Vector_base<const_slang::ast::HierarchicalReference_*,_std::allocator<const_slang::ast::HierarchicalReference_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
  ::unordered_flat_map(local_320);
  local_3f8 = &this->root;
  *(undefined1 (*) [16])((long)&this->sourceManager + 5) = (undefined1  [16])0x0;
  this->root = (__uniq_ptr_data<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>,_true,_true>
                )0x0;
  this->sourceManager = (SourceManager *)0x0;
  this->typoCorrections = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  local_328 = &this->genericClassAllocator;
  BumpAllocator::BumpAllocator(&local_328->super_BumpAllocator);
  local_330 = &this->assertionDetailsAllocator;
  BumpAllocator::BumpAllocator(&local_330->super_BumpAllocator);
  local_338 = &this->configBlockAllocator;
  BumpAllocator::BumpAllocator(&local_338->super_BumpAllocator);
  local_340 = &this->wildcardImportAllocator;
  BumpAllocator::BumpAllocator(&local_340->super_BumpAllocator);
  local_348 = &this->tempDiag;
  Diagnostic::Diagnostic(local_348,(DiagCode)0x0,(SourceLocation)0x0);
  (this->cachedParseDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedSemanticDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>.
  _M_payload.super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload.
  super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
  super__Optional_payload_base<slang::Diagnostics>._M_engaged = false;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compilationUnits).
  super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->compilationUnits).
    super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->syntaxTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unreferencedDefs).
  super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PrimitiveSymbol_*>_>_>
  ::unordered_flat_map(&this->gateMap);
  local_358 = &this->definitionFromSyntax;
  local_350 = &this->gateMap;
  boost::unordered::
  unordered_flat_map<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*,_void>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*,_std::allocator<slang::ast::DefinitionSymbol_*>_>_>_>_>
  ::unordered_flat_map(local_358);
  local_360 = &this->globalInstantiations;
  boost::unordered::
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_flat_set(local_360);
  local_368 = &this->hierarchyOverrides;
  HierarchyOverrideNode::HierarchyOverrideNode(local_368);
  local_370 = &this->defaultClockingMap;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameConflicts).
  super__Vector_base<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->externInterfaceMethods).
    super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->externInterfaceMethods).
  super__Vector_base<const_slang::ast::SubroutineSymbol_*,_std::allocator<const_slang::ast::SubroutineSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->dpiExports).
    super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dpiExports).
  super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Symbol_*>_>_>
  ::unordered_flat_map(local_370);
  local_378 = &this->globalClockingMap;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Scope_*,_const_slang::ast::Symbol_*,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Symbol_*>_>_>
  ::unordered_flat_map(local_378);
  local_380 = &this->defaultDisableMap;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Scope_*,_const_slang::ast::Expression_*,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_const_slang::ast::Expression_*>_>_>
  ::unordered_flat_map(local_380);
  local_388 = &this->configBlocks;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>_>_>_>
  ::unordered_flat_map(local_388);
  local_390 = &this->configBySyntax;
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  ::unordered_flat_map(local_390);
  local_430 = (SyntaxNode *)&this->libraryNameMap;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::SourceLibrary_*>_>_>
              *)local_430);
  local_398 = &this->instancesWithDefBinds;
  boost::unordered::
  unordered_flat_map<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  ::unordered_flat_map(local_398);
  local_3a0 = &this->externDefMap;
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
  ::unordered_flat_map(local_3a0);
  (this->netAliasAllocator).alloc = &this->super_BumpAllocator;
  (this->netAliasAllocator).freeList = (FreeNode *)0x0;
  local_3a8 = &this->netAliases;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>_>_>_>
  ::unordered_flat_map(local_3a8);
  local_400 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)&this->subroutineNameMap;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              *)local_400);
  this_00 = local_3e0;
  local_408 = &this->defaultLibMem;
  this->stdPkg = (PackageSymbol *)0x0;
  this->defaultLibMem =
       (__uniq_ptr_data<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>,_true,_true>
       )0x0;
  this->defaultLibPtr = defaultLib;
  this->bitType = (Type *)ast::builtins::Builtins::Instance;
  this->logicType = (Type *)(ast::builtins::Builtins::Instance + 0x58);
  this->intType = (Type *)(ast::builtins::Builtins::Instance + 0x210);
  this->byteType = (Type *)(ast::builtins::Builtins::Instance + 0x2c0);
  this->integerType = (Type *)(ast::builtins::Builtins::Instance + 0x318);
  this->realType = (Type *)(ast::builtins::Builtins::Instance + 0x4d0);
  this->shortRealType = (Type *)(ast::builtins::Builtins::Instance + 0x520);
  this->stringType = (Type *)(ast::builtins::Builtins::Instance + 0x5c0);
  this->voidType = (Type *)(ast::builtins::Builtins::Instance + 0x608);
  this->errorType = (Type *)(ast::builtins::Builtins::Instance + 0x890);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::syntax::SyntaxKind,_void>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
  ::rehash(local_3e0,0x25);
  local_468._0_4_ = 0x1a7;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1a7;
  uVar26 = 0x6daa2181541307b6 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  local_480 = (SourceLibrary *)&this->stdPkg;
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    uStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    uStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    uStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bStack_39 = pgVar1->m[0xf].n;
    auVar34[0] = -(local_48 == 0xb6);
    auVar34[1] = -(uStack_47 == 0xb6);
    auVar34[2] = -(uStack_46 == 0xb6);
    auVar34[3] = -(uStack_45 == 0xb6);
    auVar34[4] = -(uStack_44 == 0xb6);
    auVar34[5] = -(uStack_43 == 0xb6);
    auVar34[6] = -(uStack_42 == 0xb6);
    auVar34[7] = -(uStack_41 == 0xb6);
    auVar34[8] = -(uStack_40 == 0xb6);
    auVar34[9] = -(uStack_3f == 0xb6);
    auVar34[10] = -(uStack_3e == 0xb6);
    auVar34[0xb] = -(uStack_3d == 0xb6);
    auVar34[0xc] = -(uStack_3c == 0xb6);
    auVar34[0xd] = -(uStack_3b == 0xb6);
    auVar34[0xe] = -(uStack_3a == 0xb6);
    auVar34[0xf] = -(bStack_39 == 0xb6);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1a7) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025ce79;
      }
      this_01 = local_438;
    }
    if ((bStack_39 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x6daa2181541307b6,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x6daa2181541307b6,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025ce79:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x370);
  pTVar6 = this->intType;
  local_468._0_4_ = 0xff;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0xff;
  uVar26 = 0x99423fc5cb319876 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    uStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    uStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    uStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bStack_49 = pgVar1->m[0xf].n;
    auVar49[0] = -(local_58 == 'v');
    auVar49[1] = -(uStack_57 == 'v');
    auVar49[2] = -(uStack_56 == 'v');
    auVar49[3] = -(uStack_55 == 'v');
    auVar49[4] = -(uStack_54 == 'v');
    auVar49[5] = -(uStack_53 == 'v');
    auVar49[6] = -(uStack_52 == 'v');
    auVar49[7] = -(uStack_51 == 'v');
    auVar49[8] = -(uStack_50 == 'v');
    auVar49[9] = -(uStack_4f == 'v');
    auVar49[10] = -(uStack_4e == 'v');
    auVar49[0xb] = -(uStack_4d == 'v');
    auVar49[0xc] = -(uStack_4c == 'v');
    auVar49[0xd] = -(uStack_4b == 'v');
    auVar49[0xe] = -(uStack_4a == 'v');
    auVar49[0xf] = -(bStack_49 == 0x76);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0xff) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025cf85;
      }
      this_01 = local_438;
    }
    if ((bStack_49 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x99423fc5cb319876,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x99423fc5cb319876,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025cf85:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 0x11d;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x11d;
  uVar26 = 0x23c28382b5ec23d1 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_68 = pgVar1->m[0].n;
    uStack_67 = pgVar1->m[1].n;
    uStack_66 = pgVar1->m[2].n;
    uStack_65 = pgVar1->m[3].n;
    uStack_64 = pgVar1->m[4].n;
    uStack_63 = pgVar1->m[5].n;
    uStack_62 = pgVar1->m[6].n;
    uStack_61 = pgVar1->m[7].n;
    uStack_60 = pgVar1->m[8].n;
    uStack_5f = pgVar1->m[9].n;
    uStack_5e = pgVar1->m[10].n;
    uStack_5d = pgVar1->m[0xb].n;
    uStack_5c = pgVar1->m[0xc].n;
    uStack_5b = pgVar1->m[0xd].n;
    uStack_5a = pgVar1->m[0xe].n;
    bStack_59 = pgVar1->m[0xf].n;
    auVar35[0] = -(local_68 == 0xd1);
    auVar35[1] = -(uStack_67 == 0xd1);
    auVar35[2] = -(uStack_66 == 0xd1);
    auVar35[3] = -(uStack_65 == 0xd1);
    auVar35[4] = -(uStack_64 == 0xd1);
    auVar35[5] = -(uStack_63 == 0xd1);
    auVar35[6] = -(uStack_62 == 0xd1);
    auVar35[7] = -(uStack_61 == 0xd1);
    auVar35[8] = -(uStack_60 == 0xd1);
    auVar35[9] = -(uStack_5f == 0xd1);
    auVar35[10] = -(uStack_5e == 0xd1);
    auVar35[0xb] = -(uStack_5d == 0xd1);
    auVar35[0xc] = -(uStack_5c == 0xd1);
    auVar35[0xd] = -(uStack_5b == 0xd1);
    auVar35[0xe] = -(uStack_5a == 0xd1);
    auVar35[0xf] = -(bStack_59 == 0xd1);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x11d) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d08f;
      }
      this_01 = local_438;
    }
    if ((bStack_59 & 2) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x23c28382b5ec23d1,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x23c28382b5ec23d1,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d08f:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x3c8);
  pTVar6 = this->byteType;
  local_468._0_4_ = 0x39;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x39;
  uVar26 = 0x3a5a1a4d5795a08e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_78 = pgVar1->m[0].n;
    uStack_77 = pgVar1->m[1].n;
    uStack_76 = pgVar1->m[2].n;
    uStack_75 = pgVar1->m[3].n;
    uStack_74 = pgVar1->m[4].n;
    uStack_73 = pgVar1->m[5].n;
    uStack_72 = pgVar1->m[6].n;
    uStack_71 = pgVar1->m[7].n;
    uStack_70 = pgVar1->m[8].n;
    uStack_6f = pgVar1->m[9].n;
    uStack_6e = pgVar1->m[10].n;
    uStack_6d = pgVar1->m[0xb].n;
    uStack_6c = pgVar1->m[0xc].n;
    uStack_6b = pgVar1->m[0xd].n;
    uStack_6a = pgVar1->m[0xe].n;
    bStack_69 = pgVar1->m[0xf].n;
    auVar50[0] = -(local_78 == 0x8e);
    auVar50[1] = -(uStack_77 == 0x8e);
    auVar50[2] = -(uStack_76 == 0x8e);
    auVar50[3] = -(uStack_75 == 0x8e);
    auVar50[4] = -(uStack_74 == 0x8e);
    auVar50[5] = -(uStack_73 == 0x8e);
    auVar50[6] = -(uStack_72 == 0x8e);
    auVar50[7] = -(uStack_71 == 0x8e);
    auVar50[8] = -(uStack_70 == 0x8e);
    auVar50[9] = -(uStack_6f == 0x8e);
    auVar50[10] = -(uStack_6e == 0x8e);
    auVar50[0xb] = -(uStack_6d == 0x8e);
    auVar50[0xc] = -(uStack_6c == 0x8e);
    auVar50[0xd] = -(uStack_6b == 0x8e);
    auVar50[0xe] = -(uStack_6a == 0x8e);
    auVar50[0xf] = -(bStack_69 == 0x8e);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x39) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d198;
      }
      this_01 = local_438;
    }
    if ((bStack_69 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x3a5a1a4d5795a08e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x3a5a1a4d5795a08e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d198:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  pTVar6 = this->bitType;
  local_468._0_4_ = 0x36;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x36;
  uVar26 = 0x5fb3ad20d9b62c4f >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_88 = pgVar1->m[0].n;
    uStack_87 = pgVar1->m[1].n;
    uStack_86 = pgVar1->m[2].n;
    uStack_85 = pgVar1->m[3].n;
    uStack_84 = pgVar1->m[4].n;
    uStack_83 = pgVar1->m[5].n;
    uStack_82 = pgVar1->m[6].n;
    uStack_81 = pgVar1->m[7].n;
    uStack_80 = pgVar1->m[8].n;
    uStack_7f = pgVar1->m[9].n;
    uStack_7e = pgVar1->m[10].n;
    uStack_7d = pgVar1->m[0xb].n;
    uStack_7c = pgVar1->m[0xc].n;
    uStack_7b = pgVar1->m[0xd].n;
    uStack_7a = pgVar1->m[0xe].n;
    uStack_79 = pgVar1->m[0xf].n;
    auVar51[0] = -(local_88 == 'O');
    auVar51[1] = -(uStack_87 == 'O');
    auVar51[2] = -(uStack_86 == 'O');
    auVar51[3] = -(uStack_85 == 'O');
    auVar51[4] = -(uStack_84 == 'O');
    auVar51[5] = -(uStack_83 == 'O');
    auVar51[6] = -(uStack_82 == 'O');
    auVar51[7] = -(uStack_81 == 'O');
    auVar51[8] = -(uStack_80 == 'O');
    auVar51[9] = -(uStack_7f == 'O');
    auVar51[10] = -(uStack_7e == 'O');
    auVar51[0xb] = -(uStack_7d == 'O');
    auVar51[0xc] = -(uStack_7c == 'O');
    auVar51[0xd] = -(uStack_7b == 'O');
    auVar51[0xe] = -(uStack_7a == 'O');
    auVar51[0xf] = -(uStack_79 == 'O');
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x36) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d299;
      }
      this_01 = local_438;
    }
    if (-1 < (char)uStack_79) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x5fb3ad20d9b62c4f,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x5fb3ad20d9b62c4f,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d299:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  pTVar6 = this->logicType;
  local_468._0_4_ = 0x114;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x114;
  uVar26 = 0x93cf3bfd3c4dc60e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_98 = pgVar1->m[0].n;
    uStack_97 = pgVar1->m[1].n;
    uStack_96 = pgVar1->m[2].n;
    uStack_95 = pgVar1->m[3].n;
    uStack_94 = pgVar1->m[4].n;
    uStack_93 = pgVar1->m[5].n;
    uStack_92 = pgVar1->m[6].n;
    uStack_91 = pgVar1->m[7].n;
    uStack_90 = pgVar1->m[8].n;
    uStack_8f = pgVar1->m[9].n;
    uStack_8e = pgVar1->m[10].n;
    uStack_8d = pgVar1->m[0xb].n;
    uStack_8c = pgVar1->m[0xc].n;
    uStack_8b = pgVar1->m[0xd].n;
    uStack_8a = pgVar1->m[0xe].n;
    bStack_89 = pgVar1->m[0xf].n;
    auVar36[0] = -(local_98 == '\x0e');
    auVar36[1] = -(uStack_97 == '\x0e');
    auVar36[2] = -(uStack_96 == '\x0e');
    auVar36[3] = -(uStack_95 == '\x0e');
    auVar36[4] = -(uStack_94 == '\x0e');
    auVar36[5] = -(uStack_93 == '\x0e');
    auVar36[6] = -(uStack_92 == '\x0e');
    auVar36[7] = -(uStack_91 == '\x0e');
    auVar36[8] = -(uStack_90 == '\x0e');
    auVar36[9] = -(uStack_8f == '\x0e');
    auVar36[10] = -(uStack_8e == '\x0e');
    auVar36[0xb] = -(uStack_8d == '\x0e');
    auVar36[0xc] = -(uStack_8c == '\x0e');
    auVar36[0xd] = -(uStack_8b == '\x0e');
    auVar36[0xe] = -(uStack_8a == '\x0e');
    auVar36[0xf] = -(bStack_89 == 0xe);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x114) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d3aa;
      }
      this_01 = local_438;
    }
    if ((bStack_89 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x93cf3bfd3c4dc60e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x93cf3bfd3c4dc60e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d3aa:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 400;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 400;
  uVar26 = 0x36ae31d6e461e027 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_a8 = pgVar1->m[0].n;
    uStack_a7 = pgVar1->m[1].n;
    uStack_a6 = pgVar1->m[2].n;
    uStack_a5 = pgVar1->m[3].n;
    uStack_a4 = pgVar1->m[4].n;
    uStack_a3 = pgVar1->m[5].n;
    uStack_a2 = pgVar1->m[6].n;
    uStack_a1 = pgVar1->m[7].n;
    uStack_a0 = pgVar1->m[8].n;
    uStack_9f = pgVar1->m[9].n;
    uStack_9e = pgVar1->m[10].n;
    uStack_9d = pgVar1->m[0xb].n;
    uStack_9c = pgVar1->m[0xc].n;
    uStack_9b = pgVar1->m[0xd].n;
    uStack_9a = pgVar1->m[0xe].n;
    uStack_99 = pgVar1->m[0xf].n;
    auVar52[0] = -(local_a8 == '\'');
    auVar52[1] = -(uStack_a7 == '\'');
    auVar52[2] = -(uStack_a6 == '\'');
    auVar52[3] = -(uStack_a5 == '\'');
    auVar52[4] = -(uStack_a4 == '\'');
    auVar52[5] = -(uStack_a3 == '\'');
    auVar52[6] = -(uStack_a2 == '\'');
    auVar52[7] = -(uStack_a1 == '\'');
    auVar52[8] = -(uStack_a0 == '\'');
    auVar52[9] = -(uStack_9f == '\'');
    auVar52[10] = -(uStack_9e == '\'');
    auVar52[0xb] = -(uStack_9d == '\'');
    auVar52[0xc] = -(uStack_9c == '\'');
    auVar52[0xd] = -(uStack_9b == '\'');
    auVar52[0xe] = -(uStack_9a == '\'');
    auVar52[0xf] = -(uStack_99 == '\'');
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 400) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d4a7;
      }
      this_01 = local_438;
    }
    if (-1 < (char)uStack_99) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x36ae31d6e461e027,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x36ae31d6e461e027,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d4a7:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0xb0);
  pTVar6 = this->integerType;
  local_468._0_4_ = 0x101;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x101;
  uVar26 = 0xd5b13338c9c6918b >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_b8 = pgVar1->m[0].n;
    uStack_b7 = pgVar1->m[1].n;
    uStack_b6 = pgVar1->m[2].n;
    uStack_b5 = pgVar1->m[3].n;
    uStack_b4 = pgVar1->m[4].n;
    uStack_b3 = pgVar1->m[5].n;
    uStack_b2 = pgVar1->m[6].n;
    uStack_b1 = pgVar1->m[7].n;
    uStack_b0 = pgVar1->m[8].n;
    uStack_af = pgVar1->m[9].n;
    uStack_ae = pgVar1->m[10].n;
    uStack_ad = pgVar1->m[0xb].n;
    uStack_ac = pgVar1->m[0xc].n;
    uStack_ab = pgVar1->m[0xd].n;
    uStack_aa = pgVar1->m[0xe].n;
    bStack_a9 = pgVar1->m[0xf].n;
    auVar53[0] = -(local_b8 == 0x8b);
    auVar53[1] = -(uStack_b7 == 0x8b);
    auVar53[2] = -(uStack_b6 == 0x8b);
    auVar53[3] = -(uStack_b5 == 0x8b);
    auVar53[4] = -(uStack_b4 == 0x8b);
    auVar53[5] = -(uStack_b3 == 0x8b);
    auVar53[6] = -(uStack_b2 == 0x8b);
    auVar53[7] = -(uStack_b1 == 0x8b);
    auVar53[8] = -(uStack_b0 == 0x8b);
    auVar53[9] = -(uStack_af == 0x8b);
    auVar53[10] = -(uStack_ae == 0x8b);
    auVar53[0xb] = -(uStack_ad == 0x8b);
    auVar53[0xc] = -(uStack_ac == 0x8b);
    auVar53[0xd] = -(uStack_ab == 0x8b);
    auVar53[0xe] = -(uStack_aa == 0x8b);
    auVar53[0xf] = -(bStack_a9 == 0x8b);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x101) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d5b3;
      }
      this_01 = local_438;
    }
    if ((bStack_a9 & 8) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xd5b13338c9c6918b,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd5b13338c9c6918b,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d5b3:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 0x1d0;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1d0;
  uVar26 = 0xc48ca036b700e70e >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_c8 = pgVar1->m[0].n;
    uStack_c7 = pgVar1->m[1].n;
    uStack_c6 = pgVar1->m[2].n;
    uStack_c5 = pgVar1->m[3].n;
    uStack_c4 = pgVar1->m[4].n;
    uStack_c3 = pgVar1->m[5].n;
    uStack_c2 = pgVar1->m[6].n;
    uStack_c1 = pgVar1->m[7].n;
    uStack_c0 = pgVar1->m[8].n;
    uStack_bf = pgVar1->m[9].n;
    uStack_be = pgVar1->m[10].n;
    uStack_bd = pgVar1->m[0xb].n;
    uStack_bc = pgVar1->m[0xc].n;
    uStack_bb = pgVar1->m[0xd].n;
    uStack_ba = pgVar1->m[0xe].n;
    bStack_b9 = pgVar1->m[0xf].n;
    auVar37[0] = -(local_c8 == '\x0e');
    auVar37[1] = -(uStack_c7 == '\x0e');
    auVar37[2] = -(uStack_c6 == '\x0e');
    auVar37[3] = -(uStack_c5 == '\x0e');
    auVar37[4] = -(uStack_c4 == '\x0e');
    auVar37[5] = -(uStack_c3 == '\x0e');
    auVar37[6] = -(uStack_c2 == '\x0e');
    auVar37[7] = -(uStack_c1 == '\x0e');
    auVar37[8] = -(uStack_c0 == '\x0e');
    auVar37[9] = -(uStack_bf == '\x0e');
    auVar37[10] = -(uStack_be == '\x0e');
    auVar37[0xb] = -(uStack_bd == '\x0e');
    auVar37[0xc] = -(uStack_bc == '\x0e');
    auVar37[0xd] = -(uStack_bb == '\x0e');
    auVar37[0xe] = -(uStack_ba == '\x0e');
    auVar37[0xf] = -(bStack_b9 == 0xe);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1d0) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d6b1;
      }
      this_01 = local_438;
    }
    if ((bStack_b9 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xc48ca036b700e70e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xc48ca036b700e70e,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d6b1:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x478);
  pTVar6 = this->realType;
  local_468._0_4_ = 399;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 399;
  uVar26 = 0x9876b81d6517644d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_d8 = pgVar1->m[0].n;
    uStack_d7 = pgVar1->m[1].n;
    uStack_d6 = pgVar1->m[2].n;
    uStack_d5 = pgVar1->m[3].n;
    uStack_d4 = pgVar1->m[4].n;
    uStack_d3 = pgVar1->m[5].n;
    uStack_d2 = pgVar1->m[6].n;
    uStack_d1 = pgVar1->m[7].n;
    uStack_d0 = pgVar1->m[8].n;
    uStack_cf = pgVar1->m[9].n;
    uStack_ce = pgVar1->m[10].n;
    uStack_cd = pgVar1->m[0xb].n;
    uStack_cc = pgVar1->m[0xc].n;
    uStack_cb = pgVar1->m[0xd].n;
    uStack_ca = pgVar1->m[0xe].n;
    bStack_c9 = pgVar1->m[0xf].n;
    auVar54[0] = -(local_d8 == 'M');
    auVar54[1] = -(uStack_d7 == 'M');
    auVar54[2] = -(uStack_d6 == 'M');
    auVar54[3] = -(uStack_d5 == 'M');
    auVar54[4] = -(uStack_d4 == 'M');
    auVar54[5] = -(uStack_d3 == 'M');
    auVar54[6] = -(uStack_d2 == 'M');
    auVar54[7] = -(uStack_d1 == 'M');
    auVar54[8] = -(uStack_d0 == 'M');
    auVar54[9] = -(uStack_cf == 'M');
    auVar54[10] = -(uStack_ce == 'M');
    auVar54[0xb] = -(uStack_cd == 'M');
    auVar54[0xc] = -(uStack_cc == 'M');
    auVar54[0xd] = -(uStack_cb == 'M');
    auVar54[0xe] = -(uStack_ca == 'M');
    auVar54[0xf] = -(bStack_c9 == 0x4d);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 399) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d7bd;
      }
      this_01 = local_438;
    }
    if ((bStack_c9 & 0x20) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x9876b81d6517644d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x9876b81d6517644d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d7bd:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 0x18e;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x18e;
  uVar26 = 0xfa3f3e63e5cce853 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_e8 = pgVar1->m[0].n;
    uStack_e7 = pgVar1->m[1].n;
    uStack_e6 = pgVar1->m[2].n;
    uStack_e5 = pgVar1->m[3].n;
    uStack_e4 = pgVar1->m[4].n;
    uStack_e3 = pgVar1->m[5].n;
    uStack_e2 = pgVar1->m[6].n;
    uStack_e1 = pgVar1->m[7].n;
    uStack_e0 = pgVar1->m[8].n;
    uStack_df = pgVar1->m[9].n;
    uStack_de = pgVar1->m[10].n;
    uStack_dd = pgVar1->m[0xb].n;
    uStack_dc = pgVar1->m[0xc].n;
    uStack_db = pgVar1->m[0xd].n;
    uStack_da = pgVar1->m[0xe].n;
    bStack_d9 = pgVar1->m[0xf].n;
    auVar55[0] = -(local_e8 == 'S');
    auVar55[1] = -(uStack_e7 == 'S');
    auVar55[2] = -(uStack_e6 == 'S');
    auVar55[3] = -(uStack_e5 == 'S');
    auVar55[4] = -(uStack_e4 == 'S');
    auVar55[5] = -(uStack_e3 == 'S');
    auVar55[6] = -(uStack_e2 == 'S');
    auVar55[7] = -(uStack_e1 == 'S');
    auVar55[8] = -(uStack_e0 == 'S');
    auVar55[9] = -(uStack_df == 'S');
    auVar55[10] = -(uStack_de == 'S');
    auVar55[0xb] = -(uStack_dd == 'S');
    auVar55[0xc] = -(uStack_dc == 'S');
    auVar55[0xd] = -(uStack_db == 'S');
    auVar55[0xe] = -(uStack_da == 'S');
    auVar55[0xf] = -(bStack_d9 == 0x53);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar55 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x18e) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d8bb;
      }
      this_01 = local_438;
    }
    if ((bStack_d9 & 8) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xfa3f3e63e5cce853,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xfa3f3e63e5cce853,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d8bb:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x570);
  pTVar6 = this->shortRealType;
  local_468._0_4_ = 0x1a8;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1a8;
  uVar26 = 0xbe19b3ad35d83ce >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_f8 = pgVar1->m[0].n;
    uStack_f7 = pgVar1->m[1].n;
    uStack_f6 = pgVar1->m[2].n;
    uStack_f5 = pgVar1->m[3].n;
    uStack_f4 = pgVar1->m[4].n;
    uStack_f3 = pgVar1->m[5].n;
    uStack_f2 = pgVar1->m[6].n;
    uStack_f1 = pgVar1->m[7].n;
    uStack_f0 = pgVar1->m[8].n;
    uStack_ef = pgVar1->m[9].n;
    uStack_ee = pgVar1->m[10].n;
    uStack_ed = pgVar1->m[0xb].n;
    uStack_ec = pgVar1->m[0xc].n;
    uStack_eb = pgVar1->m[0xd].n;
    uStack_ea = pgVar1->m[0xe].n;
    bStack_e9 = pgVar1->m[0xf].n;
    auVar56[0] = -(local_f8 == 0xce);
    auVar56[1] = -(uStack_f7 == 0xce);
    auVar56[2] = -(uStack_f6 == 0xce);
    auVar56[3] = -(uStack_f5 == 0xce);
    auVar56[4] = -(uStack_f4 == 0xce);
    auVar56[5] = -(uStack_f3 == 0xce);
    auVar56[6] = -(uStack_f2 == 0xce);
    auVar56[7] = -(uStack_f1 == 0xce);
    auVar56[8] = -(uStack_f0 == 0xce);
    auVar56[9] = -(uStack_ef == 0xce);
    auVar56[10] = -(uStack_ee == 0xce);
    auVar56[0xb] = -(uStack_ed == 0xce);
    auVar56[0xc] = -(uStack_ec == 0xce);
    auVar56[0xd] = -(uStack_eb == 0xce);
    auVar56[0xe] = -(uStack_ea == 0xce);
    auVar56[0xf] = -(bStack_e9 == 0xce);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar56 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1a8) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025d9c7;
      }
      this_01 = local_438;
    }
    if ((bStack_e9 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xbe19b3ad35d83ce,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xbe19b3ad35d83ce,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025d9c7:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  pTVar6 = this->stringType;
  local_468._0_4_ = 0x1bd;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1bd;
  uVar26 = 0x66e97724479b192 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_108 = pgVar1->m[0].n;
    uStack_107 = pgVar1->m[1].n;
    uStack_106 = pgVar1->m[2].n;
    uStack_105 = pgVar1->m[3].n;
    uStack_104 = pgVar1->m[4].n;
    uStack_103 = pgVar1->m[5].n;
    uStack_102 = pgVar1->m[6].n;
    uStack_101 = pgVar1->m[7].n;
    uStack_100 = pgVar1->m[8].n;
    uStack_ff = pgVar1->m[9].n;
    uStack_fe = pgVar1->m[10].n;
    uStack_fd = pgVar1->m[0xb].n;
    uStack_fc = pgVar1->m[0xc].n;
    uStack_fb = pgVar1->m[0xd].n;
    uStack_fa = pgVar1->m[0xe].n;
    bStack_f9 = pgVar1->m[0xf].n;
    auVar38[0] = -(local_108 == 0x92);
    auVar38[1] = -(uStack_107 == 0x92);
    auVar38[2] = -(uStack_106 == 0x92);
    auVar38[3] = -(uStack_105 == 0x92);
    auVar38[4] = -(uStack_104 == 0x92);
    auVar38[5] = -(uStack_103 == 0x92);
    auVar38[6] = -(uStack_102 == 0x92);
    auVar38[7] = -(uStack_101 == 0x92);
    auVar38[8] = -(uStack_100 == 0x92);
    auVar38[9] = -(uStack_ff == 0x92);
    auVar38[10] = -(uStack_fe == 0x92);
    auVar38[0xb] = -(uStack_fd == 0x92);
    auVar38[0xc] = -(uStack_fc == 0x92);
    auVar38[0xd] = -(uStack_fb == 0x92);
    auVar38[0xe] = -(uStack_fa == 0x92);
    auVar38[0xf] = -(bStack_f9 == 0x92);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1bd) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dad8;
      }
      this_01 = local_438;
    }
    if ((bStack_f9 & 4) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x66e97724479b192,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x66e97724479b192,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dad8:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 0x3a;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x3a;
  uVar26 = 0xd8919406d6e01ce1 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_118 = pgVar1->m[0].n;
    uStack_117 = pgVar1->m[1].n;
    uStack_116 = pgVar1->m[2].n;
    uStack_115 = pgVar1->m[3].n;
    uStack_114 = pgVar1->m[4].n;
    uStack_113 = pgVar1->m[5].n;
    uStack_112 = pgVar1->m[6].n;
    uStack_111 = pgVar1->m[7].n;
    uStack_110 = pgVar1->m[8].n;
    uStack_10f = pgVar1->m[9].n;
    uStack_10e = pgVar1->m[10].n;
    uStack_10d = pgVar1->m[0xb].n;
    uStack_10c = pgVar1->m[0xc].n;
    uStack_10b = pgVar1->m[0xd].n;
    uStack_10a = pgVar1->m[0xe].n;
    bStack_109 = pgVar1->m[0xf].n;
    auVar57[0] = -(local_118 == 0xe1);
    auVar57[1] = -(uStack_117 == 0xe1);
    auVar57[2] = -(uStack_116 == 0xe1);
    auVar57[3] = -(uStack_115 == 0xe1);
    auVar57[4] = -(uStack_114 == 0xe1);
    auVar57[5] = -(uStack_113 == 0xe1);
    auVar57[6] = -(uStack_112 == 0xe1);
    auVar57[7] = -(uStack_111 == 0xe1);
    auVar57[8] = -(uStack_110 == 0xe1);
    auVar57[9] = -(uStack_10f == 0xe1);
    auVar57[10] = -(uStack_10e == 0xe1);
    auVar57[0xb] = -(uStack_10d == 0xe1);
    auVar57[0xc] = -(uStack_10c == 0xe1);
    auVar57[0xd] = -(uStack_10b == 0xe1);
    auVar57[0xe] = -(uStack_10a == 0xe1);
    auVar57[0xf] = -(bStack_109 == 0xe1);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x3a) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dbd3;
      }
      this_01 = local_438;
    }
    if ((bStack_109 & 2) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xd8919406d6e01ce1,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd8919406d6e01ce1,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dbd3:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x650);
  local_468._0_4_ = 0x14d;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x14d;
  uVar26 = 0xce29564a93e3679c >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_128 = pgVar1->m[0].n;
    uStack_127 = pgVar1->m[1].n;
    uStack_126 = pgVar1->m[2].n;
    uStack_125 = pgVar1->m[3].n;
    uStack_124 = pgVar1->m[4].n;
    uStack_123 = pgVar1->m[5].n;
    uStack_122 = pgVar1->m[6].n;
    uStack_121 = pgVar1->m[7].n;
    uStack_120 = pgVar1->m[8].n;
    uStack_11f = pgVar1->m[9].n;
    uStack_11e = pgVar1->m[10].n;
    uStack_11d = pgVar1->m[0xb].n;
    uStack_11c = pgVar1->m[0xc].n;
    uStack_11b = pgVar1->m[0xd].n;
    uStack_11a = pgVar1->m[0xe].n;
    bStack_119 = pgVar1->m[0xf].n;
    auVar58[0] = -(local_128 == 0x9c);
    auVar58[1] = -(uStack_127 == 0x9c);
    auVar58[2] = -(uStack_126 == 0x9c);
    auVar58[3] = -(uStack_125 == 0x9c);
    auVar58[4] = -(uStack_124 == 0x9c);
    auVar58[5] = -(uStack_123 == 0x9c);
    auVar58[6] = -(uStack_122 == 0x9c);
    auVar58[7] = -(uStack_121 == 0x9c);
    auVar58[8] = -(uStack_120 == 0x9c);
    auVar58[9] = -(uStack_11f == 0x9c);
    auVar58[10] = -(uStack_11e == 0x9c);
    auVar58[0xb] = -(uStack_11d == 0x9c);
    auVar58[0xc] = -(uStack_11c == 0x9c);
    auVar58[0xd] = -(uStack_11b == 0x9c);
    auVar58[0xe] = -(uStack_11a == 0x9c);
    auVar58[0xf] = -(bStack_119 == 0x9c);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x14d) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dcd8;
      }
      this_01 = local_438;
    }
    if ((bStack_119 & 0x10) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xce29564a93e3679c,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xce29564a93e3679c,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dcd8:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x698);
  pTVar6 = this->voidType;
  local_468._0_4_ = 0x207;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x207;
  uVar26 = 0xc277c71110018fd3 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_138 = pgVar1->m[0].n;
    uStack_137 = pgVar1->m[1].n;
    uStack_136 = pgVar1->m[2].n;
    uStack_135 = pgVar1->m[3].n;
    uStack_134 = pgVar1->m[4].n;
    uStack_133 = pgVar1->m[5].n;
    uStack_132 = pgVar1->m[6].n;
    uStack_131 = pgVar1->m[7].n;
    uStack_130 = pgVar1->m[8].n;
    uStack_12f = pgVar1->m[9].n;
    uStack_12e = pgVar1->m[10].n;
    uStack_12d = pgVar1->m[0xb].n;
    uStack_12c = pgVar1->m[0xc].n;
    uStack_12b = pgVar1->m[0xd].n;
    uStack_12a = pgVar1->m[0xe].n;
    bStack_129 = pgVar1->m[0xf].n;
    auVar59[0] = -(local_138 == 0xd3);
    auVar59[1] = -(uStack_137 == 0xd3);
    auVar59[2] = -(uStack_136 == 0xd3);
    auVar59[3] = -(uStack_135 == 0xd3);
    auVar59[4] = -(uStack_134 == 0xd3);
    auVar59[5] = -(uStack_133 == 0xd3);
    auVar59[6] = -(uStack_132 == 0xd3);
    auVar59[7] = -(uStack_131 == 0xd3);
    auVar59[8] = -(uStack_130 == 0xd3);
    auVar59[9] = -(uStack_12f == 0xd3);
    auVar59[10] = -(uStack_12e == 0xd3);
    auVar59[0xb] = -(uStack_12d == 0xd3);
    auVar59[0xc] = -(uStack_12c == 0xd3);
    auVar59[0xd] = -(uStack_12b == 0xd3);
    auVar59[0xe] = -(uStack_12a == 0xd3);
    auVar59[0xf] = -(bStack_129 == 0xd3);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x207) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dde4;
      }
      this_01 = local_438;
    }
    if ((bStack_129 & 8) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xc277c71110018fd3,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xc277c71110018fd3,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dde4:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  local_468._0_4_ = 0xc0;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0xc0;
  uVar26 = 0xa99b4b1f77dd0fb6 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_148 = pgVar1->m[0].n;
    uStack_147 = pgVar1->m[1].n;
    uStack_146 = pgVar1->m[2].n;
    uStack_145 = pgVar1->m[3].n;
    uStack_144 = pgVar1->m[4].n;
    uStack_143 = pgVar1->m[5].n;
    uStack_142 = pgVar1->m[6].n;
    uStack_141 = pgVar1->m[7].n;
    uStack_140 = pgVar1->m[8].n;
    uStack_13f = pgVar1->m[9].n;
    uStack_13e = pgVar1->m[10].n;
    uStack_13d = pgVar1->m[0xb].n;
    uStack_13c = pgVar1->m[0xc].n;
    uStack_13b = pgVar1->m[0xd].n;
    uStack_13a = pgVar1->m[0xe].n;
    bStack_139 = pgVar1->m[0xf].n;
    auVar39[0] = -(local_148 == 0xb6);
    auVar39[1] = -(uStack_147 == 0xb6);
    auVar39[2] = -(uStack_146 == 0xb6);
    auVar39[3] = -(uStack_145 == 0xb6);
    auVar39[4] = -(uStack_144 == 0xb6);
    auVar39[5] = -(uStack_143 == 0xb6);
    auVar39[6] = -(uStack_142 == 0xb6);
    auVar39[7] = -(uStack_141 == 0xb6);
    auVar39[8] = -(uStack_140 == 0xb6);
    auVar39[9] = -(uStack_13f == 0xb6);
    auVar39[10] = -(uStack_13e == 0xb6);
    auVar39[0xb] = -(uStack_13d == 0xb6);
    auVar39[0xc] = -(uStack_13c == 0xb6);
    auVar39[0xd] = -(uStack_13b == 0xb6);
    auVar39[0xe] = -(uStack_13a == 0xb6);
    auVar39[0xf] = -(bStack_139 == 0xb6);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0xc0) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dee2;
      }
      this_01 = local_438;
    }
    if ((bStack_139 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xa99b4b1f77dd0fb6,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xa99b4b1f77dd0fb6,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dee2:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x6e0);
  local_468._0_4_ = 0x20e;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x20e;
  uVar26 = 0x15fc1b238b0af263 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_158 = pgVar1->m[0].n;
    uStack_157 = pgVar1->m[1].n;
    uStack_156 = pgVar1->m[2].n;
    uStack_155 = pgVar1->m[3].n;
    uStack_154 = pgVar1->m[4].n;
    uStack_153 = pgVar1->m[5].n;
    uStack_152 = pgVar1->m[6].n;
    uStack_151 = pgVar1->m[7].n;
    uStack_150 = pgVar1->m[8].n;
    uStack_14f = pgVar1->m[9].n;
    uStack_14e = pgVar1->m[10].n;
    uStack_14d = pgVar1->m[0xb].n;
    uStack_14c = pgVar1->m[0xc].n;
    uStack_14b = pgVar1->m[0xd].n;
    uStack_14a = pgVar1->m[0xe].n;
    bStack_149 = pgVar1->m[0xf].n;
    auVar60[0] = -(local_158 == 'c');
    auVar60[1] = -(uStack_157 == 'c');
    auVar60[2] = -(uStack_156 == 'c');
    auVar60[3] = -(uStack_155 == 'c');
    auVar60[4] = -(uStack_154 == 'c');
    auVar60[5] = -(uStack_153 == 'c');
    auVar60[6] = -(uStack_152 == 'c');
    auVar60[7] = -(uStack_151 == 'c');
    auVar60[8] = -(uStack_150 == 'c');
    auVar60[9] = -(uStack_14f == 'c');
    auVar60[10] = -(uStack_14e == 'c');
    auVar60[0xb] = -(uStack_14d == 'c');
    auVar60[0xc] = -(uStack_14c == 'c');
    auVar60[0xd] = -(uStack_14b == 'c');
    auVar60[0xe] = -(uStack_14a == 'c');
    auVar60[0xf] = -(bStack_149 == 99);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x20e) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025dfe7;
      }
      this_01 = local_438;
    }
    if ((bStack_149 & 8) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x15fc1b238b0af263,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x15fc1b238b0af263,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025dfe7:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x728);
  local_468._0_4_ = 0x1dc;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1dc;
  uVar26 = 0x2f2654e8ae7eb62a >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_168 = pgVar1->m[0].n;
    uStack_167 = pgVar1->m[1].n;
    uStack_166 = pgVar1->m[2].n;
    uStack_165 = pgVar1->m[3].n;
    uStack_164 = pgVar1->m[4].n;
    uStack_163 = pgVar1->m[5].n;
    uStack_162 = pgVar1->m[6].n;
    uStack_161 = pgVar1->m[7].n;
    uStack_160 = pgVar1->m[8].n;
    uStack_15f = pgVar1->m[9].n;
    uStack_15e = pgVar1->m[10].n;
    uStack_15d = pgVar1->m[0xb].n;
    uStack_15c = pgVar1->m[0xc].n;
    uStack_15b = pgVar1->m[0xd].n;
    uStack_15a = pgVar1->m[0xe].n;
    bStack_159 = pgVar1->m[0xf].n;
    auVar61[0] = -(local_168 == '*');
    auVar61[1] = -(uStack_167 == '*');
    auVar61[2] = -(uStack_166 == '*');
    auVar61[3] = -(uStack_165 == '*');
    auVar61[4] = -(uStack_164 == '*');
    auVar61[5] = -(uStack_163 == '*');
    auVar61[6] = -(uStack_162 == '*');
    auVar61[7] = -(uStack_161 == '*');
    auVar61[8] = -(uStack_160 == '*');
    auVar61[9] = -(uStack_15f == '*');
    auVar61[10] = -(uStack_15e == '*');
    auVar61[0xb] = -(uStack_15d == '*');
    auVar61[0xc] = -(uStack_15c == '*');
    auVar61[0xd] = -(uStack_15b == '*');
    auVar61[0xe] = -(uStack_15a == '*');
    auVar61[0xf] = -(bStack_159 == 0x2a);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar61 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1dc) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e0ec;
      }
      this_01 = local_438;
    }
    if ((bStack_159 & 4) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x2f2654e8ae7eb62a,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x2f2654e8ae7eb62a,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025e0ec:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x770);
  local_468._0_4_ = 0x1ff;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1ff;
  uVar26 = 0xd0bbf94515adacd0 >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_178 = pgVar1->m[0].n;
    uStack_177 = pgVar1->m[1].n;
    uStack_176 = pgVar1->m[2].n;
    uStack_175 = pgVar1->m[3].n;
    uStack_174 = pgVar1->m[4].n;
    uStack_173 = pgVar1->m[5].n;
    uStack_172 = pgVar1->m[6].n;
    uStack_171 = pgVar1->m[7].n;
    uStack_170 = pgVar1->m[8].n;
    uStack_16f = pgVar1->m[9].n;
    uStack_16e = pgVar1->m[10].n;
    uStack_16d = pgVar1->m[0xb].n;
    uStack_16c = pgVar1->m[0xc].n;
    uStack_16b = pgVar1->m[0xd].n;
    uStack_16a = pgVar1->m[0xe].n;
    bStack_169 = pgVar1->m[0xf].n;
    auVar62[0] = -(local_178 == 0xd0);
    auVar62[1] = -(uStack_177 == 0xd0);
    auVar62[2] = -(uStack_176 == 0xd0);
    auVar62[3] = -(uStack_175 == 0xd0);
    auVar62[4] = -(uStack_174 == 0xd0);
    auVar62[5] = -(uStack_173 == 0xd0);
    auVar62[6] = -(uStack_172 == 0xd0);
    auVar62[7] = -(uStack_171 == 0xd0);
    auVar62[8] = -(uStack_170 == 0xd0);
    auVar62[9] = -(uStack_16f == 0xd0);
    auVar62[10] = -(uStack_16e == 0xd0);
    auVar62[0xb] = -(uStack_16d == 0xd0);
    auVar62[0xc] = -(uStack_16c == 0xd0);
    auVar62[0xd] = -(uStack_16b == 0xd0);
    auVar62[0xe] = -(uStack_16a == 0xd0);
    auVar62[0xf] = -(bStack_169 == 0xd0);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar62 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar62 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar62 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar62 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar62 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar62 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar62 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar62 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar62 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar62 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar62 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar62 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar62 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar62 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar62 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1ff) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e1f1;
      }
      this_01 = local_438;
    }
    if ((bStack_169 & 1) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0xd0bbf94515adacd0,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0xd0bbf94515adacd0,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025e1f1:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x7b8);
  local_468._0_4_ = 0x1a5;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x1a5;
  uVar26 = 0x313b2e0e557e0f8d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_188 = pgVar1->m[0].n;
    uStack_187 = pgVar1->m[1].n;
    uStack_186 = pgVar1->m[2].n;
    uStack_185 = pgVar1->m[3].n;
    uStack_184 = pgVar1->m[4].n;
    uStack_183 = pgVar1->m[5].n;
    uStack_182 = pgVar1->m[6].n;
    uStack_181 = pgVar1->m[7].n;
    uStack_180 = pgVar1->m[8].n;
    uStack_17f = pgVar1->m[9].n;
    uStack_17e = pgVar1->m[10].n;
    uStack_17d = pgVar1->m[0xb].n;
    uStack_17c = pgVar1->m[0xc].n;
    uStack_17b = pgVar1->m[0xd].n;
    uStack_17a = pgVar1->m[0xe].n;
    bStack_179 = pgVar1->m[0xf].n;
    auVar63[0] = -(local_188 == 0x8d);
    auVar63[1] = -(uStack_187 == 0x8d);
    auVar63[2] = -(uStack_186 == 0x8d);
    auVar63[3] = -(uStack_185 == 0x8d);
    auVar63[4] = -(uStack_184 == 0x8d);
    auVar63[5] = -(uStack_183 == 0x8d);
    auVar63[6] = -(uStack_182 == 0x8d);
    auVar63[7] = -(uStack_181 == 0x8d);
    auVar63[8] = -(uStack_180 == 0x8d);
    auVar63[9] = -(uStack_17f == 0x8d);
    auVar63[10] = -(uStack_17e == 0x8d);
    auVar63[0xb] = -(uStack_17d == 0x8d);
    auVar63[0xc] = -(uStack_17c == 0x8d);
    auVar63[0xd] = -(uStack_17b == 0x8d);
    auVar63[0xe] = -(uStack_17a == 0x8d);
    auVar63[0xf] = -(bStack_179 == 0x8d);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x1a5) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e2f6;
      }
      this_01 = local_438;
    }
    if ((bStack_179 & 0x20) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x313b2e0e557e0f8d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x313b2e0e557e0f8d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025e2f6:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x800);
  local_468._0_4_ = 0x180;
  uVar18 = local_468._0_4_;
  local_468._0_4_ = 0x180;
  uVar26 = 0x5336963eefba1f6d >>
           ((byte)(this->knownTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_198 = pgVar1->m[0].n;
    uStack_197 = pgVar1->m[1].n;
    uStack_196 = pgVar1->m[2].n;
    uStack_195 = pgVar1->m[3].n;
    uStack_194 = pgVar1->m[4].n;
    uStack_193 = pgVar1->m[5].n;
    uStack_192 = pgVar1->m[6].n;
    uStack_191 = pgVar1->m[7].n;
    uStack_190 = pgVar1->m[8].n;
    uStack_18f = pgVar1->m[9].n;
    uStack_18e = pgVar1->m[10].n;
    uStack_18d = pgVar1->m[0xb].n;
    uStack_18c = pgVar1->m[0xc].n;
    uStack_18b = pgVar1->m[0xd].n;
    uStack_18a = pgVar1->m[0xe].n;
    bStack_189 = pgVar1->m[0xf].n;
    auVar64[0] = -(local_198 == 'm');
    auVar64[1] = -(uStack_197 == 'm');
    auVar64[2] = -(uStack_196 == 'm');
    auVar64[3] = -(uStack_195 == 'm');
    auVar64[4] = -(uStack_194 == 'm');
    auVar64[5] = -(uStack_193 == 'm');
    auVar64[6] = -(uStack_192 == 'm');
    auVar64[7] = -(uStack_191 == 'm');
    auVar64[8] = -(uStack_190 == 'm');
    auVar64[9] = -(uStack_18f == 'm');
    auVar64[10] = -(uStack_18e == 'm');
    auVar64[0xb] = -(uStack_18d == 'm');
    auVar64[0xc] = -(uStack_18c == 'm');
    auVar64[0xd] = -(uStack_18b == 'm');
    auVar64[0xe] = -(uStack_18a == 'm');
    auVar64[0xf] = -(bStack_189 == 0x6d);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar64 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar64 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar64 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar64 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar64 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar64 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar64 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar64 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar64 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar64 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar64 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar64 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar64 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar64 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar64 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x180) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e3fb;
      }
      this_01 = local_438;
    }
    if ((bStack_189 & 0x20) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,uVar26,0x5336963eefba1f6d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    local_468._0_4_ = uVar18;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0x5336963eefba1f6d,(try_emplace_args_t *)&registerScalar,
               (SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025e3fb:
  pSVar30->thisSym = (Symbol *)(ast::builtins::Builtins::Instance + 0x848);
  pTVar6 = this->errorType;
  auVar16._12_4_ = 0;
  auVar16._0_12_ = stack0xfffffffffffffb9c;
  _local_468 = (string_view)(auVar16 << 0x20);
  uVar27 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.groups_size_mask;
  ppVar5 = (this->knownTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar33 = 0;
  uVar26 = 0;
  do {
    pgVar1 = (this->knownTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar33;
    local_1a8 = pgVar1->m[0].n;
    uStack_1a7 = pgVar1->m[1].n;
    uStack_1a6 = pgVar1->m[2].n;
    uStack_1a5 = pgVar1->m[3].n;
    uStack_1a4 = pgVar1->m[4].n;
    uStack_1a3 = pgVar1->m[5].n;
    uStack_1a2 = pgVar1->m[6].n;
    uStack_1a1 = pgVar1->m[7].n;
    uStack_1a0 = pgVar1->m[8].n;
    uStack_19f = pgVar1->m[9].n;
    uStack_19e = pgVar1->m[10].n;
    uStack_19d = pgVar1->m[0xb].n;
    uStack_19c = pgVar1->m[0xc].n;
    uStack_19b = pgVar1->m[0xd].n;
    uStack_19a = pgVar1->m[0xe].n;
    bStack_199 = pgVar1->m[0xf].n;
    auVar40[0] = -(local_1a8 == '\b');
    auVar40[1] = -(uStack_1a7 == '\b');
    auVar40[2] = -(uStack_1a6 == '\b');
    auVar40[3] = -(uStack_1a5 == '\b');
    auVar40[4] = -(uStack_1a4 == '\b');
    auVar40[5] = -(uStack_1a3 == '\b');
    auVar40[6] = -(uStack_1a2 == '\b');
    auVar40[7] = -(uStack_1a1 == '\b');
    auVar40[8] = -(uStack_1a0 == '\b');
    auVar40[9] = -(uStack_19f == '\b');
    auVar40[10] = -(uStack_19e == '\b');
    auVar40[0xb] = -(uStack_19d == '\b');
    auVar40[0xc] = -(uStack_19c == '\b');
    auVar40[0xd] = -(uStack_19b == '\b');
    auVar40[0xe] = -(uStack_19a == '\b');
    auVar40[0xf] = -(bStack_199 == 8);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(int *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0) {
        pSVar30 = (Scope *)((long)&ppVar5[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e4ea;
      }
    }
    if ((bStack_199 & 1) == 0) break;
    lVar32 = uVar33 + uVar26;
    uVar26 = uVar26 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar26 <= uVar27);
  if ((this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->knownTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,_const_slang::ast::Type_*>,_slang::hash<slang::syntax::SyntaxKind>,_std::equal_to<slang::syntax::SyntaxKind>,_std::allocator<std::pair<const_slang::syntax::SyntaxKind,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0,0,(try_emplace_args_t *)&registerScalar,(SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxKind,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxKind,void>,std::equal_to<slang::syntax::SyntaxKind>,std::allocator<std::pair<slang::syntax::SyntaxKind_const,slang::ast::Type_const*>>>
                *)this_00,0,(try_emplace_args_t *)&registerScalar,(SyntaxKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025e4ea:
  pSVar30->thisSym = &pTVar6->super_Symbol;
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::TokenKind,_void>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>_>_>_>
  ::rehash(this_01,0x13);
  local_46c = (undefined1  [4])0x1;
  _local_468 = parsing::LexerFacts::getTokenKindText(WireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = WireKeyword;
  uVar26 = 0xa9849bd92785fb4 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_1b8 = pgVar2->m[0].n;
    uStack_1b7 = pgVar2->m[1].n;
    uStack_1b6 = pgVar2->m[2].n;
    uStack_1b5 = pgVar2->m[3].n;
    uStack_1b4 = pgVar2->m[4].n;
    uStack_1b3 = pgVar2->m[5].n;
    uStack_1b2 = pgVar2->m[6].n;
    uStack_1b1 = pgVar2->m[7].n;
    uStack_1b0 = pgVar2->m[8].n;
    uStack_1af = pgVar2->m[9].n;
    uStack_1ae = pgVar2->m[10].n;
    uStack_1ad = pgVar2->m[0xb].n;
    uStack_1ac = pgVar2->m[0xc].n;
    uStack_1ab = pgVar2->m[0xd].n;
    uStack_1aa = pgVar2->m[0xe].n;
    bStack_1a9 = pgVar2->m[0xf].n;
    auVar41[0] = -(local_1b8 == 0xb4);
    auVar41[1] = -(uStack_1b7 == 0xb4);
    auVar41[2] = -(uStack_1b6 == 0xb4);
    auVar41[3] = -(uStack_1b5 == 0xb4);
    auVar41[4] = -(uStack_1b4 == 0xb4);
    auVar41[5] = -(uStack_1b3 == 0xb4);
    auVar41[6] = -(uStack_1b2 == 0xb4);
    auVar41[7] = -(uStack_1b1 == 0xb4);
    auVar41[8] = -(uStack_1b0 == 0xb4);
    auVar41[9] = -(uStack_1af == 0xb4);
    auVar41[10] = -(uStack_1ae == 0xb4);
    auVar41[0xb] = -(uStack_1ad == 0xb4);
    auVar41[0xc] = -(uStack_1ac == 0xb4);
    auVar41[0xd] = -(uStack_1ab == 0xb4);
    auVar41[0xe] = -(uStack_1aa == 0xb4);
    auVar41[0xf] = -(bStack_1a9 == 0xb4);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x14f) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e635;
      }
      this_01 = local_438;
    }
    if ((bStack_1a9 & 0x10) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xa9849bd92785fb4,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xa9849bd92785fb4,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025e635:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x2;
  _local_468 = parsing::LexerFacts::getTokenKindText(WAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = WAndKeyword;
  uVar26 = 0x554b6f6496b97636 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_1c8 = pgVar2->m[0].n;
    uStack_1c7 = pgVar2->m[1].n;
    uStack_1c6 = pgVar2->m[2].n;
    uStack_1c5 = pgVar2->m[3].n;
    uStack_1c4 = pgVar2->m[4].n;
    uStack_1c3 = pgVar2->m[5].n;
    uStack_1c2 = pgVar2->m[6].n;
    uStack_1c1 = pgVar2->m[7].n;
    uStack_1c0 = pgVar2->m[8].n;
    uStack_1bf = pgVar2->m[9].n;
    uStack_1be = pgVar2->m[10].n;
    uStack_1bd = pgVar2->m[0xb].n;
    uStack_1bc = pgVar2->m[0xc].n;
    uStack_1bb = pgVar2->m[0xd].n;
    uStack_1ba = pgVar2->m[0xe].n;
    bStack_1b9 = pgVar2->m[0xf].n;
    auVar65[0] = -(local_1c8 == '6');
    auVar65[1] = -(uStack_1c7 == '6');
    auVar65[2] = -(uStack_1c6 == '6');
    auVar65[3] = -(uStack_1c5 == '6');
    auVar65[4] = -(uStack_1c4 == '6');
    auVar65[5] = -(uStack_1c3 == '6');
    auVar65[6] = -(uStack_1c2 == '6');
    auVar65[7] = -(uStack_1c1 == '6');
    auVar65[8] = -(uStack_1c0 == '6');
    auVar65[9] = -(uStack_1bf == '6');
    auVar65[10] = -(uStack_1be == '6');
    auVar65[0xb] = -(uStack_1bd == '6');
    auVar65[0xc] = -(uStack_1bc == '6');
    auVar65[0xd] = -(uStack_1bb == '6');
    auVar65[0xe] = -(uStack_1ba == '6');
    auVar65[0xf] = -(bStack_1b9 == 0x36);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x149) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e77f;
      }
      this_01 = local_438;
    }
    if ((bStack_1b9 & 0x40) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x554b6f6496b97636,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x554b6f6496b97636,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025e77f:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x3;
  _local_468 = parsing::LexerFacts::getTokenKindText(WOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = WOrKeyword;
  uVar26 = 0xe53eb6ea1057d36a >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_1d8 = pgVar2->m[0].n;
    uStack_1d7 = pgVar2->m[1].n;
    uStack_1d6 = pgVar2->m[2].n;
    uStack_1d5 = pgVar2->m[3].n;
    uStack_1d4 = pgVar2->m[4].n;
    uStack_1d3 = pgVar2->m[5].n;
    uStack_1d2 = pgVar2->m[6].n;
    uStack_1d1 = pgVar2->m[7].n;
    uStack_1d0 = pgVar2->m[8].n;
    uStack_1cf = pgVar2->m[9].n;
    uStack_1ce = pgVar2->m[10].n;
    uStack_1cd = pgVar2->m[0xb].n;
    uStack_1cc = pgVar2->m[0xc].n;
    uStack_1cb = pgVar2->m[0xd].n;
    uStack_1ca = pgVar2->m[0xe].n;
    bStack_1c9 = pgVar2->m[0xf].n;
    auVar66[0] = -(local_1d8 == 'j');
    auVar66[1] = -(uStack_1d7 == 'j');
    auVar66[2] = -(uStack_1d6 == 'j');
    auVar66[3] = -(uStack_1d5 == 'j');
    auVar66[4] = -(uStack_1d4 == 'j');
    auVar66[5] = -(uStack_1d3 == 'j');
    auVar66[6] = -(uStack_1d2 == 'j');
    auVar66[7] = -(uStack_1d1 == 'j');
    auVar66[8] = -(uStack_1d0 == 'j');
    auVar66[9] = -(uStack_1cf == 'j');
    auVar66[10] = -(uStack_1ce == 'j');
    auVar66[0xb] = -(uStack_1cd == 'j');
    auVar66[0xc] = -(uStack_1cc == 'j');
    auVar66[0xd] = -(uStack_1cb == 'j');
    auVar66[0xe] = -(uStack_1ca == 'j');
    auVar66[0xf] = -(bStack_1c9 == 0x6a);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x152) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025e8c9;
      }
      this_01 = local_438;
    }
    if ((bStack_1c9 & 4) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xe53eb6ea1057d36a,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xe53eb6ea1057d36a,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025e8c9:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x4;
  _local_468 = parsing::LexerFacts::getTokenKindText(TriKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = TriKeyword;
  uVar26 = 0x1e4f7fba270851a7 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_1e8 = pgVar2->m[0].n;
    uStack_1e7 = pgVar2->m[1].n;
    uStack_1e6 = pgVar2->m[2].n;
    uStack_1e5 = pgVar2->m[3].n;
    uStack_1e4 = pgVar2->m[4].n;
    uStack_1e3 = pgVar2->m[5].n;
    uStack_1e2 = pgVar2->m[6].n;
    uStack_1e1 = pgVar2->m[7].n;
    uStack_1e0 = pgVar2->m[8].n;
    uStack_1df = pgVar2->m[9].n;
    uStack_1de = pgVar2->m[10].n;
    uStack_1dd = pgVar2->m[0xb].n;
    uStack_1dc = pgVar2->m[0xc].n;
    uStack_1db = pgVar2->m[0xd].n;
    uStack_1da = pgVar2->m[0xe].n;
    uStack_1d9 = pgVar2->m[0xf].n;
    auVar67[0] = -(local_1e8 == 0xa7);
    auVar67[1] = -(uStack_1e7 == 0xa7);
    auVar67[2] = -(uStack_1e6 == 0xa7);
    auVar67[3] = -(uStack_1e5 == 0xa7);
    auVar67[4] = -(uStack_1e4 == 0xa7);
    auVar67[5] = -(uStack_1e3 == 0xa7);
    auVar67[6] = -(uStack_1e2 == 0xa7);
    auVar67[7] = -(uStack_1e1 == 0xa7);
    auVar67[8] = -(uStack_1e0 == 0xa7);
    auVar67[9] = -(uStack_1df == 0xa7);
    auVar67[10] = -(uStack_1de == 0xa7);
    auVar67[0xb] = -(uStack_1dd == 0xa7);
    auVar67[0xc] = -(uStack_1dc == 0xa7);
    auVar67[0xd] = -(uStack_1db == 0xa7);
    auVar67[0xe] = -(uStack_1da == 0xa7);
    auVar67[0xf] = -(uStack_1d9 == 0xa7);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar67 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar67 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar67 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar67 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar67 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar67 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar67 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar67 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar67 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar67 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar67 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar67 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar67 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar67 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar67 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x132) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025ea12;
      }
      this_01 = local_438;
    }
    if (-1 < (char)uStack_1d9) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x1e4f7fba270851a7,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x1e4f7fba270851a7,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025ea12:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x5;
  _local_468 = parsing::LexerFacts::getTokenKindText(TriAndKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = TriAndKeyword;
  uVar26 = 0xf8f5ece6a4e7c5e7 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_1f8 = pgVar2->m[0].n;
    uStack_1f7 = pgVar2->m[1].n;
    uStack_1f6 = pgVar2->m[2].n;
    uStack_1f5 = pgVar2->m[3].n;
    uStack_1f4 = pgVar2->m[4].n;
    uStack_1f3 = pgVar2->m[5].n;
    uStack_1f2 = pgVar2->m[6].n;
    uStack_1f1 = pgVar2->m[7].n;
    uStack_1f0 = pgVar2->m[8].n;
    uStack_1ef = pgVar2->m[9].n;
    uStack_1ee = pgVar2->m[10].n;
    uStack_1ed = pgVar2->m[0xb].n;
    uStack_1ec = pgVar2->m[0xc].n;
    uStack_1eb = pgVar2->m[0xd].n;
    uStack_1ea = pgVar2->m[0xe].n;
    uStack_1e9 = pgVar2->m[0xf].n;
    auVar68[0] = -(local_1f8 == 0xe7);
    auVar68[1] = -(uStack_1f7 == 0xe7);
    auVar68[2] = -(uStack_1f6 == 0xe7);
    auVar68[3] = -(uStack_1f5 == 0xe7);
    auVar68[4] = -(uStack_1f4 == 0xe7);
    auVar68[5] = -(uStack_1f3 == 0xe7);
    auVar68[6] = -(uStack_1f2 == 0xe7);
    auVar68[7] = -(uStack_1f1 == 0xe7);
    auVar68[8] = -(uStack_1f0 == 0xe7);
    auVar68[9] = -(uStack_1ef == 0xe7);
    auVar68[10] = -(uStack_1ee == 0xe7);
    auVar68[0xb] = -(uStack_1ed == 0xe7);
    auVar68[0xc] = -(uStack_1ec == 0xe7);
    auVar68[0xd] = -(uStack_1eb == 0xe7);
    auVar68[0xe] = -(uStack_1ea == 0xe7);
    auVar68[0xf] = -(uStack_1e9 == 0xe7);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar68 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar68 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar68 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar68 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar68 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar68 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar68 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar68 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar68 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar68 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar68 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar68 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar68 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar68 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar68 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x135) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025eb5b;
      }
      this_01 = local_438;
    }
    if (-1 < (char)uStack_1e9) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xf8f5ece6a4e7c5e7,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xf8f5ece6a4e7c5e7,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025eb5b:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x6;
  _local_468 = parsing::LexerFacts::getTokenKindText(TriOrKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = TriOrKeyword;
  uVar26 = 0x972d66a0243241d1 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_208 = pgVar2->m[0].n;
    uStack_207 = pgVar2->m[1].n;
    uStack_206 = pgVar2->m[2].n;
    uStack_205 = pgVar2->m[3].n;
    uStack_204 = pgVar2->m[4].n;
    uStack_203 = pgVar2->m[5].n;
    uStack_202 = pgVar2->m[6].n;
    uStack_201 = pgVar2->m[7].n;
    uStack_200 = pgVar2->m[8].n;
    uStack_1ff = pgVar2->m[9].n;
    uStack_1fe = pgVar2->m[10].n;
    uStack_1fd = pgVar2->m[0xb].n;
    uStack_1fc = pgVar2->m[0xc].n;
    uStack_1fb = pgVar2->m[0xd].n;
    uStack_1fa = pgVar2->m[0xe].n;
    bStack_1f9 = pgVar2->m[0xf].n;
    auVar42[0] = -(local_208 == 0xd1);
    auVar42[1] = -(uStack_207 == 0xd1);
    auVar42[2] = -(uStack_206 == 0xd1);
    auVar42[3] = -(uStack_205 == 0xd1);
    auVar42[4] = -(uStack_204 == 0xd1);
    auVar42[5] = -(uStack_203 == 0xd1);
    auVar42[6] = -(uStack_202 == 0xd1);
    auVar42[7] = -(uStack_201 == 0xd1);
    auVar42[8] = -(uStack_200 == 0xd1);
    auVar42[9] = -(uStack_1ff == 0xd1);
    auVar42[10] = -(uStack_1fe == 0xd1);
    auVar42[0xb] = -(uStack_1fd == 0xd1);
    auVar42[0xc] = -(uStack_1fc == 0xd1);
    auVar42[0xd] = -(uStack_1fb == 0xd1);
    auVar42[0xe] = -(uStack_1fa == 0xd1);
    auVar42[0xf] = -(bStack_1f9 == 0xd1);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x136) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025eca1;
      }
      this_01 = local_438;
    }
    if ((bStack_1f9 & 2) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x972d66a0243241d1,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x972d66a0243241d1,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025eca1:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x7;
  _local_468 = parsing::LexerFacts::getTokenKindText(Tri0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = Tri0Keyword;
  uVar26 = 0xbc86f973a652cd92 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_218 = pgVar2->m[0].n;
    uStack_217 = pgVar2->m[1].n;
    uStack_216 = pgVar2->m[2].n;
    uStack_215 = pgVar2->m[3].n;
    uStack_214 = pgVar2->m[4].n;
    uStack_213 = pgVar2->m[5].n;
    uStack_212 = pgVar2->m[6].n;
    uStack_211 = pgVar2->m[7].n;
    uStack_210 = pgVar2->m[8].n;
    uStack_20f = pgVar2->m[9].n;
    uStack_20e = pgVar2->m[10].n;
    uStack_20d = pgVar2->m[0xb].n;
    uStack_20c = pgVar2->m[0xc].n;
    uStack_20b = pgVar2->m[0xd].n;
    uStack_20a = pgVar2->m[0xe].n;
    bStack_209 = pgVar2->m[0xf].n;
    auVar43[0] = -(local_218 == 0x92);
    auVar43[1] = -(uStack_217 == 0x92);
    auVar43[2] = -(uStack_216 == 0x92);
    auVar43[3] = -(uStack_215 == 0x92);
    auVar43[4] = -(uStack_214 == 0x92);
    auVar43[5] = -(uStack_213 == 0x92);
    auVar43[6] = -(uStack_212 == 0x92);
    auVar43[7] = -(uStack_211 == 0x92);
    auVar43[8] = -(uStack_210 == 0x92);
    auVar43[9] = -(uStack_20f == 0x92);
    auVar43[10] = -(uStack_20e == 0x92);
    auVar43[0xb] = -(uStack_20d == 0x92);
    auVar43[0xc] = -(uStack_20c == 0x92);
    auVar43[0xd] = -(uStack_20b == 0x92);
    auVar43[0xe] = -(uStack_20a == 0x92);
    auVar43[0xf] = -(bStack_209 == 0x92);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x133) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025ede7;
      }
      this_01 = local_438;
    }
    if ((bStack_209 & 4) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xbc86f973a652cd92,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xbc86f973a652cd92,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025ede7:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x8;
  _local_468 = parsing::LexerFacts::getTokenKindText(Tri1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = Tri1Keyword;
  uVar26 = 0x5abe732d259d49fa >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_228 = pgVar2->m[0].n;
    uStack_227 = pgVar2->m[1].n;
    uStack_226 = pgVar2->m[2].n;
    uStack_225 = pgVar2->m[3].n;
    uStack_224 = pgVar2->m[4].n;
    uStack_223 = pgVar2->m[5].n;
    uStack_222 = pgVar2->m[6].n;
    uStack_221 = pgVar2->m[7].n;
    uStack_220 = pgVar2->m[8].n;
    uStack_21f = pgVar2->m[9].n;
    uStack_21e = pgVar2->m[10].n;
    uStack_21d = pgVar2->m[0xb].n;
    uStack_21c = pgVar2->m[0xc].n;
    uStack_21b = pgVar2->m[0xd].n;
    uStack_21a = pgVar2->m[0xe].n;
    bStack_219 = pgVar2->m[0xf].n;
    auVar69[0] = -(local_228 == 0xfa);
    auVar69[1] = -(uStack_227 == 0xfa);
    auVar69[2] = -(uStack_226 == 0xfa);
    auVar69[3] = -(uStack_225 == 0xfa);
    auVar69[4] = -(uStack_224 == 0xfa);
    auVar69[5] = -(uStack_223 == 0xfa);
    auVar69[6] = -(uStack_222 == 0xfa);
    auVar69[7] = -(uStack_221 == 0xfa);
    auVar69[8] = -(uStack_220 == 0xfa);
    auVar69[9] = -(uStack_21f == 0xfa);
    auVar69[10] = -(uStack_21e == 0xfa);
    auVar69[0xb] = -(uStack_21d == 0xfa);
    auVar69[0xc] = -(uStack_21c == 0xfa);
    auVar69[0xd] = -(uStack_21b == 0xfa);
    auVar69[0xe] = -(uStack_21a == 0xfa);
    auVar69[0xf] = -(bStack_219 == 0xfa);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x134) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025ef31;
      }
      this_01 = local_438;
    }
    if ((bStack_219 & 4) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x5abe732d259d49fa,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x5abe732d259d49fa,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025ef31:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0x9;
  _local_468 = parsing::LexerFacts::getTokenKindText(TriRegKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = TriRegKeyword;
  uVar26 = 0x3564e059a37cbd43 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_238 = pgVar2->m[0].n;
    uStack_237 = pgVar2->m[1].n;
    uStack_236 = pgVar2->m[2].n;
    uStack_235 = pgVar2->m[3].n;
    uStack_234 = pgVar2->m[4].n;
    uStack_233 = pgVar2->m[5].n;
    uStack_232 = pgVar2->m[6].n;
    uStack_231 = pgVar2->m[7].n;
    uStack_230 = pgVar2->m[8].n;
    uStack_22f = pgVar2->m[9].n;
    uStack_22e = pgVar2->m[10].n;
    uStack_22d = pgVar2->m[0xb].n;
    uStack_22c = pgVar2->m[0xc].n;
    uStack_22b = pgVar2->m[0xd].n;
    uStack_22a = pgVar2->m[0xe].n;
    bStack_229 = pgVar2->m[0xf].n;
    auVar70[0] = -(local_238 == 'C');
    auVar70[1] = -(uStack_237 == 'C');
    auVar70[2] = -(uStack_236 == 'C');
    auVar70[3] = -(uStack_235 == 'C');
    auVar70[4] = -(uStack_234 == 'C');
    auVar70[5] = -(uStack_233 == 'C');
    auVar70[6] = -(uStack_232 == 'C');
    auVar70[7] = -(uStack_231 == 'C');
    auVar70[8] = -(uStack_230 == 'C');
    auVar70[9] = -(uStack_22f == 'C');
    auVar70[10] = -(uStack_22e == 'C');
    auVar70[0xb] = -(uStack_22d == 'C');
    auVar70[0xc] = -(uStack_22c == 'C');
    auVar70[0xd] = -(uStack_22b == 'C');
    auVar70[0xe] = -(uStack_22a == 'C');
    auVar70[0xf] = -(bStack_229 == 0x43);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x137) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f07b;
      }
      this_01 = local_438;
    }
    if ((bStack_229 & 8) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x3564e059a37cbd43,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x3564e059a37cbd43,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025f07b:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0xa;
  _local_468 = parsing::LexerFacts::getTokenKindText(Supply0Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = Supply0Keyword;
  uVar26 = 0xd90f5ddbb1ab0b6c >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_248 = pgVar2->m[0].n;
    uStack_247 = pgVar2->m[1].n;
    uStack_246 = pgVar2->m[2].n;
    uStack_245 = pgVar2->m[3].n;
    uStack_244 = pgVar2->m[4].n;
    uStack_243 = pgVar2->m[5].n;
    uStack_242 = pgVar2->m[6].n;
    uStack_241 = pgVar2->m[7].n;
    uStack_240 = pgVar2->m[8].n;
    uStack_23f = pgVar2->m[9].n;
    uStack_23e = pgVar2->m[10].n;
    uStack_23d = pgVar2->m[0xb].n;
    uStack_23c = pgVar2->m[0xc].n;
    uStack_23b = pgVar2->m[0xd].n;
    uStack_23a = pgVar2->m[0xe].n;
    bStack_239 = pgVar2->m[0xf].n;
    auVar71[0] = -(local_248 == 'l');
    auVar71[1] = -(uStack_247 == 'l');
    auVar71[2] = -(uStack_246 == 'l');
    auVar71[3] = -(uStack_245 == 'l');
    auVar71[4] = -(uStack_244 == 'l');
    auVar71[5] = -(uStack_243 == 'l');
    auVar71[6] = -(uStack_242 == 'l');
    auVar71[7] = -(uStack_241 == 'l');
    auVar71[8] = -(uStack_240 == 'l');
    auVar71[9] = -(uStack_23f == 'l');
    auVar71[10] = -(uStack_23e == 'l');
    auVar71[0xb] = -(uStack_23d == 'l');
    auVar71[0xc] = -(uStack_23c == 'l');
    auVar71[0xd] = -(uStack_23b == 'l');
    auVar71[0xe] = -(uStack_23a == 'l');
    auVar71[0xf] = -(bStack_239 == 0x6c);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x123) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f1c5;
      }
      this_01 = local_438;
    }
    if ((bStack_239 & 0x10) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xd90f5ddbb1ab0b6c,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xd90f5ddbb1ab0b6c,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025f1c5:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0xb;
  _local_468 = parsing::LexerFacts::getTokenKindText(Supply1Keyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = Supply1Keyword;
  uVar26 = 0x7746d79530f58740 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_258 = pgVar2->m[0].n;
    uStack_257 = pgVar2->m[1].n;
    uStack_256 = pgVar2->m[2].n;
    uStack_255 = pgVar2->m[3].n;
    uStack_254 = pgVar2->m[4].n;
    uStack_253 = pgVar2->m[5].n;
    uStack_252 = pgVar2->m[6].n;
    uStack_251 = pgVar2->m[7].n;
    uStack_250 = pgVar2->m[8].n;
    uStack_24f = pgVar2->m[9].n;
    uStack_24e = pgVar2->m[10].n;
    uStack_24d = pgVar2->m[0xb].n;
    uStack_24c = pgVar2->m[0xc].n;
    uStack_24b = pgVar2->m[0xd].n;
    uStack_24a = pgVar2->m[0xe].n;
    bStack_249 = pgVar2->m[0xf].n;
    auVar72[0] = -(local_258 == '@');
    auVar72[1] = -(uStack_257 == '@');
    auVar72[2] = -(uStack_256 == '@');
    auVar72[3] = -(uStack_255 == '@');
    auVar72[4] = -(uStack_254 == '@');
    auVar72[5] = -(uStack_253 == '@');
    auVar72[6] = -(uStack_252 == '@');
    auVar72[7] = -(uStack_251 == '@');
    auVar72[8] = -(uStack_250 == '@');
    auVar72[9] = -(uStack_24f == '@');
    auVar72[10] = -(uStack_24e == '@');
    auVar72[0xb] = -(uStack_24d == '@');
    auVar72[0xc] = -(uStack_24c == '@');
    auVar72[0xd] = -(uStack_24b == '@');
    auVar72[0xe] = -(uStack_24a == '@');
    auVar72[0xf] = -(bStack_249 == 0x40);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x124) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f30f;
      }
      this_01 = local_438;
    }
    if ((bStack_249 & 1) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x7746d79530f58740,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x7746d79530f58740,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025f30f:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0xc;
  _local_468 = parsing::LexerFacts::getTokenKindText(UWireKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = UWireKeyword;
  uVar26 = 0x1c71b521bb012ad >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_268 = pgVar2->m[0].n;
    uStack_267 = pgVar2->m[1].n;
    uStack_266 = pgVar2->m[2].n;
    uStack_265 = pgVar2->m[3].n;
    uStack_264 = pgVar2->m[4].n;
    uStack_263 = pgVar2->m[5].n;
    uStack_262 = pgVar2->m[6].n;
    uStack_261 = pgVar2->m[7].n;
    uStack_260 = pgVar2->m[8].n;
    uStack_25f = pgVar2->m[9].n;
    uStack_25e = pgVar2->m[10].n;
    uStack_25d = pgVar2->m[0xb].n;
    uStack_25c = pgVar2->m[0xc].n;
    uStack_25b = pgVar2->m[0xd].n;
    uStack_25a = pgVar2->m[0xe].n;
    bStack_259 = pgVar2->m[0xf].n;
    auVar73[0] = -(local_268 == 0xad);
    auVar73[1] = -(uStack_267 == 0xad);
    auVar73[2] = -(uStack_266 == 0xad);
    auVar73[3] = -(uStack_265 == 0xad);
    auVar73[4] = -(uStack_264 == 0xad);
    auVar73[5] = -(uStack_263 == 0xad);
    auVar73[6] = -(uStack_262 == 0xad);
    auVar73[7] = -(uStack_261 == 0xad);
    auVar73[8] = -(uStack_260 == 0xad);
    auVar73[9] = -(uStack_25f == 0xad);
    auVar73[10] = -(uStack_25e == 0xad);
    auVar73[0xb] = -(uStack_25d == 0xad);
    auVar73[0xc] = -(uStack_25c == 0xad);
    auVar73[0xd] = -(uStack_25b == 0xad);
    auVar73[0xe] = -(uStack_25a == 0xad);
    auVar73[0xf] = -(bStack_259 == 0xad);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x142) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f459;
      }
      this_01 = local_438;
    }
    if ((bStack_259 & 0x20) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0x1c71b521bb012ad,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0x1c71b521bb012ad,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025f459:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  local_46c = (undefined1  [4])0xd;
  _local_468 = parsing::LexerFacts::getTokenKindText(InterconnectKeyword);
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Type&>
            ((NetKind *)&registerScalar,
             (basic_string_view<char,_std::char_traits<char>_> *)local_46c,(Type *)local_468);
  local_482 = InterconnectKeyword;
  uVar26 = 0xfd1f9f31f2e67429 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar29 = 0;
  uVar33 = uVar26;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_278 = pgVar2->m[0].n;
    uStack_277 = pgVar2->m[1].n;
    uStack_276 = pgVar2->m[2].n;
    uStack_275 = pgVar2->m[3].n;
    uStack_274 = pgVar2->m[4].n;
    uStack_273 = pgVar2->m[5].n;
    uStack_272 = pgVar2->m[6].n;
    uStack_271 = pgVar2->m[7].n;
    uStack_270 = pgVar2->m[8].n;
    uStack_26f = pgVar2->m[9].n;
    uStack_26e = pgVar2->m[10].n;
    uStack_26d = pgVar2->m[0xb].n;
    uStack_26c = pgVar2->m[0xc].n;
    uStack_26b = pgVar2->m[0xd].n;
    uStack_26a = pgVar2->m[0xe].n;
    bStack_269 = pgVar2->m[0xf].n;
    auVar74[0] = -(local_278 == ')');
    auVar74[1] = -(uStack_277 == ')');
    auVar74[2] = -(uStack_276 == ')');
    auVar74[3] = -(uStack_275 == ')');
    auVar74[4] = -(uStack_274 == ')');
    auVar74[5] = -(uStack_273 == ')');
    auVar74[6] = -(uStack_272 == ')');
    auVar74[7] = -(uStack_271 == ')');
    auVar74[8] = -(uStack_270 == ')');
    auVar74[9] = -(uStack_26f == ')');
    auVar74[10] = -(uStack_26e == ')');
    auVar74[0xb] = -(uStack_26d == ')');
    auVar74[0xc] = -(uStack_26c == ')');
    auVar74[0xd] = -(uStack_26b == ')');
    auVar74[0xe] = -(uStack_26a == ')');
    auVar74[0xf] = -(bStack_269 == 0x29);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 199) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f5a3;
      }
      this_01 = local_438;
    }
    if ((bStack_269 & 2) == 0) break;
    lVar32 = uVar33 + uVar29;
    uVar29 = uVar29 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar29 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar26,0xfd1f9f31f2e67429,&local_483,&local_482);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xfd1f9f31f2e67429,&local_483,&local_482);
    pSVar30 = local_448;
  }
LAB_0025f5a3:
  aVar17.this = registerScalar.this;
  registerScalar.this = (Compilation *)0x0;
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)aVar17.this);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &registerScalar);
  registerScalar.this = registerScalar.this & 0xffffffff00000000;
  std::
  make_unique<slang::ast::NetType,slang::ast::NetType::NetKind,char_const(&)[8],slang::ast::Type&>
            ((NetKind *)local_468,(char (*) [8])&registerScalar,(Type *)"<error>");
  local_46c = (undefined1  [4])((uint)local_46c & 0xffff0000);
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar33 = 0;
  uVar26 = 0;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_288 = pgVar2->m[0].n;
    uStack_287 = pgVar2->m[1].n;
    uStack_286 = pgVar2->m[2].n;
    uStack_285 = pgVar2->m[3].n;
    uStack_284 = pgVar2->m[4].n;
    uStack_283 = pgVar2->m[5].n;
    uStack_282 = pgVar2->m[6].n;
    uStack_281 = pgVar2->m[7].n;
    uStack_280 = pgVar2->m[8].n;
    uStack_27f = pgVar2->m[9].n;
    uStack_27e = pgVar2->m[10].n;
    uStack_27d = pgVar2->m[0xb].n;
    uStack_27c = pgVar2->m[0xc].n;
    uStack_27b = pgVar2->m[0xd].n;
    uStack_27a = pgVar2->m[0xe].n;
    bStack_279 = pgVar2->m[0xf].n;
    auVar44[0] = -(local_288 == '\b');
    auVar44[1] = -(uStack_287 == '\b');
    auVar44[2] = -(uStack_286 == '\b');
    auVar44[3] = -(uStack_285 == '\b');
    auVar44[4] = -(uStack_284 == '\b');
    auVar44[5] = -(uStack_283 == '\b');
    auVar44[6] = -(uStack_282 == '\b');
    auVar44[7] = -(uStack_281 == '\b');
    auVar44[8] = -(uStack_280 == '\b');
    auVar44[9] = -(uStack_27f == '\b');
    auVar44[10] = -(uStack_27e == '\b');
    auVar44[0xb] = -(uStack_27d == '\b');
    auVar44[0xc] = -(uStack_27c == '\b');
    auVar44[0xd] = -(uStack_27b == '\b');
    auVar44[0xe] = -(uStack_27a == '\b');
    auVar44[0xf] = -(bStack_279 == 8);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f6b2;
      }
    }
    if ((bStack_279 & 1) == 0) break;
    lVar32 = uVar33 + uVar26;
    uVar26 = uVar26 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar26 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0,0,(try_emplace_args_t *)&local_482,(TokenKind *)local_46c);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0,(try_emplace_args_t *)&local_482,(TokenKind *)local_46c);
    pSVar30 = local_448;
  }
LAB_0025f6b2:
  auVar19 = local_468;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_460._M_p;
  _local_468 = (string_view)(auVar14 << 0x40);
  std::__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::reset
            ((__uniq_ptr_impl<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)
             &pSVar30->thisSym,(pointer)auVar19);
  std::unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_>::~unique_ptr
            ((unique_ptr<slang::ast::NetType,_std::default_delete<slang::ast::NetType>_> *)local_468
            );
  local_468._0_2_ = 0x14f;
  uVar29 = 0xa9849bd92785fb4 >>
           ((byte)(this->knownNetTypes).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.elements_;
  uVar27 = (this->knownNetTypes).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
           .arrays.groups_size_mask;
  uVar26 = 0;
  uVar33 = uVar29;
  do {
    pgVar2 = (this->knownNetTypes).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
             .arrays.groups_ + uVar33;
    local_298 = pgVar2->m[0].n;
    uStack_297 = pgVar2->m[1].n;
    uStack_296 = pgVar2->m[2].n;
    uStack_295 = pgVar2->m[3].n;
    uStack_294 = pgVar2->m[4].n;
    uStack_293 = pgVar2->m[5].n;
    uStack_292 = pgVar2->m[6].n;
    uStack_291 = pgVar2->m[7].n;
    uStack_290 = pgVar2->m[8].n;
    uStack_28f = pgVar2->m[9].n;
    uStack_28e = pgVar2->m[10].n;
    uStack_28d = pgVar2->m[0xb].n;
    uStack_28c = pgVar2->m[0xc].n;
    uStack_28b = pgVar2->m[0xd].n;
    uStack_28a = pgVar2->m[0xe].n;
    bStack_289 = pgVar2->m[0xf].n;
    auVar45[0] = -(local_298 == 0xb4);
    auVar45[1] = -(uStack_297 == 0xb4);
    auVar45[2] = -(uStack_296 == 0xb4);
    auVar45[3] = -(uStack_295 == 0xb4);
    auVar45[4] = -(uStack_294 == 0xb4);
    auVar45[5] = -(uStack_293 == 0xb4);
    auVar45[6] = -(uStack_292 == 0xb4);
    auVar45[7] = -(uStack_291 == 0xb4);
    auVar45[8] = -(uStack_290 == 0xb4);
    auVar45[9] = -(uStack_28f == 0xb4);
    auVar45[10] = -(uStack_28e == 0xb4);
    auVar45[0xb] = -(uStack_28d == 0xb4);
    auVar45[0xc] = -(uStack_28c == 0xb4);
    auVar45[0xd] = -(uStack_28b == 0xb4);
    auVar45[0xe] = -(uStack_28a == 0xb4);
    auVar45[0xf] = -(bStack_289 == 0xb4);
    for (uVar28 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe); uVar28 != 0;
        uVar28 = uVar28 - 1 & uVar28) {
      iVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
        }
      }
      if (*(short *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4)) == 0x14f) {
        pSVar30 = (Scope *)((long)&ppVar7[uVar33 * 0xf].first + (ulong)(uint)(iVar22 << 4));
        goto LAB_0025f7b6;
      }
    }
    if ((bStack_289 & 0x10) == 0) break;
    lVar32 = uVar33 + uVar26;
    uVar26 = uVar26 + 1;
    uVar33 = lVar32 + 1U & uVar27;
  } while (uVar26 <= uVar27);
  if ((this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.size <
      (this->knownNetTypes).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>,_slang::hash<slang::parsing::TokenKind>,_std::equal_to<slang::parsing::TokenKind>,_std::allocator<std::pair<const_slang::parsing::TokenKind,_std::unique_ptr<slang::ast::NetType>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,uVar29,0xa9849bd92785fb4,(try_emplace_args_t *)&registerScalar,
               (TokenKind *)local_468);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::parsing::TokenKind>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::parsing::TokenKind,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::parsing::TokenKind,void>,std::equal_to<slang::parsing::TokenKind>,std::allocator<std::pair<slang::parsing::TokenKind_const,std::unique_ptr<slang::ast::NetType,std::default_delete<slang::ast::NetType>>>>>
                *)this_01,0xa9849bd92785fb4,(try_emplace_args_t *)&registerScalar,
               (TokenKind *)local_468);
    pSVar30 = local_448;
  }
LAB_0025f7b6:
  this->wireNetType = (NetType *)pSVar30->thisSym;
  registerScalar.this = this;
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,this->bitType);
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,this->logicType);
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,(ScalarType *)(ast::builtins::Builtins::Instance + 0xb0));
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,(ScalarType *)(ast::builtins::Builtins::Instance + 0x108));
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,(ScalarType *)(ast::builtins::Builtins::Instance + 0x160));
  Compilation(slang::Bag_const&,slang::SourceLibrary_const*)::$_0::operator()
            ((__0 *)&registerScalar,(ScalarType *)(ast::builtins::Builtins::Instance + 0x1b8));
  std::make_unique<slang::ast::RootSymbol,slang::ast::Compilation&>((Compilation *)&local_458);
  __p = local_458._M_allocated_capacity;
  local_458._M_allocated_capacity = 0;
  std::__uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::reset
            ((__uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              *)local_3f8,(pointer)__p);
  std::unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>::~unique_ptr
            ((unique_ptr<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_> *)
             &local_458._M_allocated_capacity);
  std::
  vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
  ::operator=(local_3e8,
              (vector<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
               *)(ast::builtins::Builtins::Instance + 0x8d8));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_400,
              (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)(ast::builtins::Builtins::Instance + 0x8f0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
  ::operator=(local_3f0,
              (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               *)(ast::builtins::Builtins::Instance + 0x920));
  pPVar23 = ast::builtins::createStdPackage(this);
  this->stdPkg = pPVar23;
  sv = &(pPVar23->super_Symbol).name;
  uVar24 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_428
                      ,sv);
  uVar29 = uVar24 >> ((byte)(this->packageMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar32 = (uVar24 & 0xff) * 4;
  uVar48 = (&UNK_0040c7ac)[lVar32];
  uVar75 = (&UNK_0040c7ad)[lVar32];
  uVar76 = (&UNK_0040c7ae)[lVar32];
  bVar77 = (&UNK_0040c7af)[lVar32];
  uVar26 = (ulong)((uint)uVar24 & 7);
  uVar27 = 0;
  uVar33 = uVar29;
  uVar78 = uVar48;
  uVar79 = uVar75;
  uVar80 = uVar76;
  bVar81 = bVar77;
  uVar82 = uVar48;
  uVar83 = uVar75;
  uVar84 = uVar76;
  bVar85 = bVar77;
  uVar86 = uVar48;
  uVar87 = uVar75;
  uVar88 = uVar76;
  bVar89 = bVar77;
  do {
    pgVar8 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_;
    pgVar4 = pgVar8 + uVar33;
    local_2a8 = pgVar4->m[0].n;
    uStack_2a7 = pgVar4->m[1].n;
    uStack_2a6 = pgVar4->m[2].n;
    bStack_2a5 = pgVar4->m[3].n;
    uStack_2a4 = pgVar4->m[4].n;
    uStack_2a3 = pgVar4->m[5].n;
    uStack_2a2 = pgVar4->m[6].n;
    bStack_2a1 = pgVar4->m[7].n;
    uStack_2a0 = pgVar4->m[8].n;
    uStack_29f = pgVar4->m[9].n;
    uStack_29e = pgVar4->m[10].n;
    bStack_29d = pgVar4->m[0xb].n;
    uStack_29c = pgVar4->m[0xc].n;
    uStack_29b = pgVar4->m[0xd].n;
    uStack_29a = pgVar4->m[0xe].n;
    bVar21 = pgVar4->m[0xf].n;
    auVar46[0] = -(local_2a8 == uVar48);
    auVar46[1] = -(uStack_2a7 == uVar75);
    auVar46[2] = -(uStack_2a6 == uVar76);
    auVar46[3] = -(bStack_2a5 == bVar77);
    auVar46[4] = -(uStack_2a4 == uVar78);
    auVar46[5] = -(uStack_2a3 == uVar79);
    auVar46[6] = -(uStack_2a2 == uVar80);
    auVar46[7] = -(bStack_2a1 == bVar81);
    auVar46[8] = -(uStack_2a0 == uVar82);
    auVar46[9] = -(uStack_29f == uVar83);
    auVar46[10] = -(uStack_29e == uVar84);
    auVar46[0xb] = -(bStack_29d == bVar85);
    auVar46[0xc] = -(uStack_29c == uVar86);
    auVar46[0xd] = -(uStack_29b == uVar87);
    auVar46[0xe] = -(uStack_29a == uVar88);
    auVar46[0xf] = -(bVar21 == bVar89);
    uVar28 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe);
    bStack_299 = bVar21;
    if (uVar28 != 0) {
      local_3c8 = CONCAT17(bVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,CONCAT13(bVar77,
                                                  CONCAT12(uVar76,CONCAT11(uVar75,uVar48)))))));
      ppVar9 = (this->packageMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
               .arrays.elements_;
      local_420 = uVar26;
      local_418 = uVar24;
      local_410 = uVar33;
      local_3d8 = uVar27;
      uStack_3c0 = uVar82;
      uStack_3bf = uVar83;
      uStack_3be = uVar84;
      bStack_3bd = bVar85;
      uStack_3bc = uVar86;
      uStack_3bb = uVar87;
      uStack_3ba = uVar88;
      bStack_3b9 = bVar89;
      do {
        uVar13 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        bVar20 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_428,sv,&ppVar9[uVar33 * 0xf + (ulong)uVar13].first);
        if (bVar20) goto LAB_0025fa1a;
        uVar28 = uVar28 - 1 & uVar28;
      } while (uVar28 != 0);
      bVar21 = pgVar8[uVar33].m[0xf].n;
      uVar27 = local_3d8;
      uVar33 = local_410;
      uVar26 = local_420;
      uVar24 = local_418;
      uVar48 = (uchar)local_3c8;
      uVar75 = local_3c8._1_1_;
      uVar76 = local_3c8._2_1_;
      bVar77 = local_3c8._3_1_;
      uVar78 = local_3c8._4_1_;
      uVar79 = local_3c8._5_1_;
      uVar80 = local_3c8._6_1_;
      bVar81 = local_3c8._7_1_;
      uVar82 = uStack_3c0;
      uVar83 = uStack_3bf;
      uVar84 = uStack_3be;
      bVar85 = bStack_3bd;
      uVar86 = uStack_3bc;
      uVar87 = uStack_3bb;
      uVar88 = uStack_3ba;
      bVar89 = bStack_3b9;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar26] & bVar21) == 0) break;
    uVar10 = (this->packageMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
             .arrays.groups_size_mask;
    lVar32 = uVar33 + uVar27;
    uVar27 = uVar27 + 1;
    uVar33 = lVar32 + 1U & uVar10;
  } while (uVar27 <= uVar10);
  if ((this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.size <
      (this->packageMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::PackageSymbol_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_428,uVar29,uVar24,(try_emplace_args_t *)local_468,sv,
               (PackageSymbol **)local_480);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::PackageSymbol_const*&>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PackageSymbol_const*>>>
                *)local_428,uVar24,(try_emplace_args_t *)local_468,sv,(PackageSymbol **)local_480);
  }
LAB_0025fa1a:
  ast::builtins::registerGateTypes(this);
  pSVar25 = this->defaultLibPtr;
  if (pSVar25 == (SourceLibrary *)0x0) {
    s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_458,
                 "work",4);
    local_46c = (undefined1  [4])0x7fffffff;
    std::make_unique<slang::SourceLibrary,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
               (int *)local_458._M_local_buf);
    auVar19 = local_468;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_460._M_p;
    _local_468 = (string_view)(auVar15 << 0x40);
    std::__uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::reset
              ((__uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
               local_408,(pointer)auVar19);
    std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>::~unique_ptr
              ((unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_> *)
               local_468);
    std::__cxx11::string::~string((string *)local_458._M_local_buf);
    pSVar25 = (this->defaultLibMem)._M_t.
              super___uniq_ptr_impl<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::SourceLibrary_*,_std::default_delete<slang::SourceLibrary>_>
              .super__Head_base<0UL,_slang::SourceLibrary_*,_false>._M_head_impl;
    pSVar25->isDefault = true;
    this->defaultLibPtr = pSVar25;
  }
  local_460._M_p = (pSVar25->name)._M_dataplus._M_p;
  local_468 = (undefined1  [8])(pSVar25->name)._M_string_length;
  local_480 = pSVar25;
  uVar24 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_430
                      ,(basic_string_view<char,_std::char_traits<char>_> *)local_468);
  uVar27 = uVar24 >> ((byte)(this->libraryNameMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar32 = (uVar24 & 0xff) * 4;
  uVar48 = (&UNK_0040c7ac)[lVar32];
  uVar75 = (&UNK_0040c7ad)[lVar32];
  uVar76 = (&UNK_0040c7ae)[lVar32];
  bVar77 = (&UNK_0040c7af)[lVar32];
  uVar33 = (ulong)((uint)uVar24 & 7);
  uVar31 = 0;
  uVar26 = uVar27;
  uVar78 = uVar48;
  uVar79 = uVar75;
  uVar80 = uVar76;
  bVar81 = bVar77;
  uVar82 = uVar48;
  uVar83 = uVar75;
  uVar84 = uVar76;
  bVar85 = bVar77;
  uVar86 = uVar48;
  uVar87 = uVar75;
  uVar88 = uVar76;
  bVar89 = bVar77;
  do {
    pgVar11 = (this->libraryNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
              .arrays.groups_;
    pgVar3 = pgVar11 + uVar26;
    local_2b8 = pgVar3->m[0].n;
    uStack_2b7 = pgVar3->m[1].n;
    uStack_2b6 = pgVar3->m[2].n;
    bStack_2b5 = pgVar3->m[3].n;
    uStack_2b4 = pgVar3->m[4].n;
    uStack_2b3 = pgVar3->m[5].n;
    uStack_2b2 = pgVar3->m[6].n;
    bStack_2b1 = pgVar3->m[7].n;
    uStack_2b0 = pgVar3->m[8].n;
    uStack_2af = pgVar3->m[9].n;
    uStack_2ae = pgVar3->m[10].n;
    bStack_2ad = pgVar3->m[0xb].n;
    uStack_2ac = pgVar3->m[0xc].n;
    uStack_2ab = pgVar3->m[0xd].n;
    uStack_2aa = pgVar3->m[0xe].n;
    bVar21 = pgVar3->m[0xf].n;
    auVar47[0] = -(local_2b8 == uVar48);
    auVar47[1] = -(uStack_2b7 == uVar75);
    auVar47[2] = -(uStack_2b6 == uVar76);
    auVar47[3] = -(bStack_2b5 == bVar77);
    auVar47[4] = -(uStack_2b4 == uVar78);
    auVar47[5] = -(uStack_2b3 == uVar79);
    auVar47[6] = -(uStack_2b2 == uVar80);
    auVar47[7] = -(bStack_2b1 == bVar81);
    auVar47[8] = -(uStack_2b0 == uVar82);
    auVar47[9] = -(uStack_2af == uVar83);
    auVar47[10] = -(uStack_2ae == uVar84);
    auVar47[0xb] = -(bStack_2ad == bVar85);
    auVar47[0xc] = -(uStack_2ac == uVar86);
    auVar47[0xd] = -(uStack_2ab == uVar87);
    auVar47[0xe] = -(uStack_2aa == uVar88);
    auVar47[0xf] = -(bVar21 == bVar89);
    uVar28 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
    bStack_2a9 = bVar21;
    if (uVar28 != 0) {
      local_3d8 = CONCAT17(bVar81,CONCAT16(uVar80,CONCAT15(uVar79,CONCAT14(uVar78,CONCAT13(bVar77,
                                                  CONCAT12(uVar76,CONCAT11(uVar75,uVar48)))))));
      ppVar12 = (this->libraryNameMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
                .arrays.elements_;
      local_420 = uVar26;
      local_418 = uVar31;
      local_410 = uVar33;
      uStack_3d0 = uVar82;
      uStack_3cf = uVar83;
      uStack_3ce = uVar84;
      bStack_3cd = bVar85;
      uStack_3cc = uVar86;
      uStack_3cb = uVar87;
      uStack_3ca = uVar88;
      bStack_3c9 = bVar89;
      local_3c8 = uVar24;
      local_3b0 = uVar27;
      do {
        uVar13 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        pSVar30 = (Scope *)(ppVar12 + uVar26 * 0xf + (ulong)uVar13);
        bVar20 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_430,(basic_string_view<char,_std::char_traits<char>_> *)local_468,
                            (basic_string_view<char,_std::char_traits<char>_> *)pSVar30);
        if (bVar20) goto LAB_0025fc38;
        uVar28 = uVar28 - 1 & uVar28;
      } while (uVar28 != 0);
      bVar21 = pgVar11[uVar26].m[0xf].n;
      uVar24 = local_3c8;
      uVar27 = local_3b0;
      uVar33 = local_410;
      uVar31 = local_418;
      uVar26 = local_420;
      uVar48 = (uchar)local_3d8;
      uVar75 = local_3d8._1_1_;
      uVar76 = local_3d8._2_1_;
      bVar77 = local_3d8._3_1_;
      uVar78 = local_3d8._4_1_;
      uVar79 = local_3d8._5_1_;
      uVar80 = local_3d8._6_1_;
      bVar81 = local_3d8._7_1_;
      uVar82 = uStack_3d0;
      uVar83 = uStack_3cf;
      uVar84 = uStack_3ce;
      bVar85 = bStack_3cd;
      uVar86 = uStack_3cc;
      uVar87 = uStack_3cb;
      uVar88 = uStack_3ca;
      bVar89 = bStack_3c9;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar33] & bVar21) == 0) break;
    uVar29 = (this->libraryNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
             .arrays.groups_size_mask;
    uVar26 = uVar26 + 1 + uVar31;
    uVar31 = uVar31 + 1;
    uVar26 = uVar26 & uVar29;
  } while (uVar31 <= uVar29);
  if ((this->libraryNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
      .size_ctrl.size <
      (this->libraryNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::SourceLibrary_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::SourceLibrary_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                *)local_430,uVar27,uVar24,(try_emplace_args_t *)local_46c,
               (basic_string_view<char,_std::char_traits<char>_> *)local_468);
    pSVar30 = local_448;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&local_458,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLibrary_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::SourceLibrary_const*>>>
                *)local_430,uVar24,(try_emplace_args_t *)local_46c,
               (basic_string_view<char,_std::char_traits<char>_> *)local_468);
    pSVar30 = local_448;
  }
LAB_0025fc38:
  local_458._M_allocated_capacity = (size_type)local_468;
  pSVar30->nameMap = (SymbolMap *)local_480;
  *in_FS_OFFSET = (long)&local_458;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar22 = pthread_once(&Compilation::onceFlag._M_once,__once_proxy);
  if (iVar22 != 0) {
    std::__throw_system_error(iVar22);
  }
  *in_FS_OFFSET = 0;
  *in_FS_OFFSET = 0;
  this->nextEnumSystemId = 1;
  this->nextStructSystemId = 1;
  this->nextUnionSystemId = 1;
  return;
}

Assistant:

Compilation::Compilation(const Bag& options, const SourceLibrary* defaultLib) :
    options(options.getOrDefault<CompilationOptions>()), driverMapAllocator(*this),
    unrollIntervalMapAllocator(*this), tempDiag({}, {}), netAliasAllocator(*this),
    defaultLibPtr(defaultLib) {

    // Construct all built-in types.
    auto& bi = slang::ast::builtins::Builtins::Instance;
    bitType = &bi.bitType;
    logicType = &bi.logicType;
    intType = &bi.intType;
    byteType = &bi.byteType;
    integerType = &bi.integerType;
    realType = &bi.realType;
    shortRealType = &bi.shortRealType;
    stringType = &bi.stringType;
    voidType = &bi.voidType;
    errorType = &bi.errorType;

    auto regType = &bi.regType;
    auto signedBitType = &bi.signedBitType;
    auto signedLogicType = &bi.signedLogicType;
    auto signedRegType = &bi.signedRegType;
    auto shortIntType = &bi.shortIntType;
    auto longIntType = &bi.longIntType;
    auto timeType = &bi.timeType;
    auto realTimeType = &bi.realTimeType;
    auto chandleType = &bi.chandleType;
    auto nullType = &bi.nullType;
    auto eventType = &bi.eventType;
    auto unboundedType = &bi.unboundedType;
    auto typeRefType = &bi.typeRefType;
    auto untypedType = &bi.untypedType;
    auto sequenceType = &bi.sequenceType;
    auto propertyType = &bi.propertyType;

    // Register built-in types for lookup by syntax kind.
    knownTypes.reserve(32);
    knownTypes[SyntaxKind::ShortIntType] = shortIntType;
    knownTypes[SyntaxKind::IntType] = intType;
    knownTypes[SyntaxKind::LongIntType] = longIntType;
    knownTypes[SyntaxKind::ByteType] = byteType;
    knownTypes[SyntaxKind::BitType] = bitType;
    knownTypes[SyntaxKind::LogicType] = logicType;
    knownTypes[SyntaxKind::RegType] = regType;
    knownTypes[SyntaxKind::IntegerType] = integerType;
    knownTypes[SyntaxKind::TimeType] = timeType;
    knownTypes[SyntaxKind::RealType] = realType;
    knownTypes[SyntaxKind::RealTimeType] = realTimeType;
    knownTypes[SyntaxKind::ShortRealType] = shortRealType;
    knownTypes[SyntaxKind::StringType] = stringType;
    knownTypes[SyntaxKind::CHandleType] = chandleType;
    knownTypes[SyntaxKind::NullLiteralExpression] = nullType;
    knownTypes[SyntaxKind::VoidType] = voidType;
    knownTypes[SyntaxKind::EventType] = eventType;
    knownTypes[SyntaxKind::WildcardLiteralExpression] = unboundedType;
    knownTypes[SyntaxKind::TypeReference] = typeRefType;
    knownTypes[SyntaxKind::Untyped] = untypedType;
    knownTypes[SyntaxKind::SequenceType] = sequenceType;
    knownTypes[SyntaxKind::PropertyType] = propertyType;
    knownTypes[SyntaxKind::Unknown] = errorType;

#define MAKE_NETTYPE(type)                                               \
    knownNetTypes[TokenKind::type##Keyword] = std::make_unique<NetType>( \
        NetType::type, LexerFacts::getTokenKindText(TokenKind::type##Keyword), *logicType)

    knownNetTypes.reserve(16);
    MAKE_NETTYPE(Wire);
    MAKE_NETTYPE(WAnd);
    MAKE_NETTYPE(WOr);
    MAKE_NETTYPE(Tri);
    MAKE_NETTYPE(TriAnd);
    MAKE_NETTYPE(TriOr);
    MAKE_NETTYPE(Tri0);
    MAKE_NETTYPE(Tri1);
    MAKE_NETTYPE(TriReg);
    MAKE_NETTYPE(Supply0);
    MAKE_NETTYPE(Supply1);
    MAKE_NETTYPE(UWire);
    MAKE_NETTYPE(Interconnect);

    knownNetTypes[TokenKind::Unknown] = std::make_unique<NetType>(NetType::Unknown, "<error>",
                                                                  *logicType);
    wireNetType = knownNetTypes[TokenKind::WireKeyword].get();

#undef MAKE_NETTYPE

    // Scalar types are indexed by bit flags.
    auto registerScalar = [this](auto type) {
        scalarTypeTable[type->getIntegralFlags().bits() & 0x7] = type;
    };
    registerScalar(bitType);
    registerScalar(logicType);
    registerScalar(regType);
    registerScalar(signedBitType);
    registerScalar(signedLogicType);
    registerScalar(signedRegType);

    root = std::make_unique<RootSymbol>(*this);

    // Copy in all built-in system tasks, functions, and methods.
    systemSubroutines = bi.systemSubroutines;
    subroutineNameMap = bi.subroutineNameMap;
    methodMap = bi.methodMap;

    // Register the built-in std package.
    stdPkg = &builtins::createStdPackage(*this);
    packageMap.emplace(stdPkg->name, stdPkg);

    // Register the built-in gate types.
    builtins::registerGateTypes(*this);

    // Register the default library.
    if (defaultLibPtr) {
        SLANG_ASSERT(defaultLibPtr->isDefault);
    }
    else {
        defaultLibMem = std::make_unique<SourceLibrary>("work"s, INT_MAX);
        defaultLibMem->isDefault = true;
        defaultLibPtr = defaultLibMem.get();
    }
    libraryNameMap[defaultLibPtr->name] = defaultLibPtr;

    // Set a default handler for printing types and symbol paths, for convenience.
    static std::once_flag onceFlag;
    std::call_once(onceFlag, [] {
        DiagnosticEngine::setDefaultFormatter<const Type*>(std::make_unique<TypeArgFormatter>());
        DiagnosticEngine::setDefaultSymbolPathCB(
            [](const Symbol& sym) { return sym.getHierarchicalPath(); });
    });

    // Reset systemId counters that may have been changed due to creation of types
    // in the std package.
    nextEnumSystemId = 1;
    nextStructSystemId = 1;
    nextUnionSystemId = 1;
}